

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  ulong uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [12];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar69;
  int iVar70;
  int iVar71;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  byte bVar75;
  byte bVar76;
  byte bVar77;
  ulong uVar78;
  int iVar79;
  ulong uVar80;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  uint uVar81;
  long lVar82;
  byte bVar83;
  byte bVar84;
  ulong uVar85;
  uint uVar86;
  uint uVar87;
  uint uVar142;
  uint uVar143;
  uint uVar145;
  uint uVar146;
  uint uVar147;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  uint uVar144;
  uint uVar148;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar97 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float pp;
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar166;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar167 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar200;
  float fVar201;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar216 [32];
  float fVar223;
  float fVar230;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar228;
  float fVar229;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar239;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar238 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [64];
  float fVar248;
  float fVar255;
  undefined1 auVar251 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar253;
  float fVar254;
  undefined1 auVar252 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  float s;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  float local_9e0;
  undefined1 local_9b0 [16];
  ulong local_998;
  uint local_98c;
  float local_988;
  float local_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  RTCFilterFunctionNArguments local_870;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_670 [16];
  undefined1 local_660 [16];
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [16];
  Primitive *local_630;
  ulong local_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  RTCHitN local_540 [16];
  undefined1 auStack_530 [16];
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [16];
  uint local_4d0;
  uint uStack_4cc;
  uint uStack_4c8;
  uint uStack_4c4;
  uint uStack_4c0;
  uint uStack_4bc;
  uint uStack_4b8;
  uint uStack_4b4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar1 = prim[1];
  uVar80 = (ulong)(byte)PVar1;
  fVar201 = *(float *)(prim + uVar80 * 0x19 + 0x12);
  auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar91 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar13 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar97 = vsubps_avx(auVar90,*(undefined1 (*) [16])(prim + uVar80 * 0x19 + 6));
  fVar200 = fVar201 * auVar97._0_4_;
  fVar149 = fVar201 * auVar13._0_4_;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar80 * 4 + 6);
  auVar103 = vpmovsxbd_avx2(auVar90);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar80 * 5 + 6);
  auVar101 = vpmovsxbd_avx2(auVar91);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar80 * 6 + 6);
  auVar105 = vpmovsxbd_avx2(auVar88);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar80 * 0xb + 6);
  auVar104 = vpmovsxbd_avx2(auVar92);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6);
  auVar110 = vpmovsxbd_avx2(auVar93);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar106 = vcvtdq2ps_avx(auVar110);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + (uint)(byte)PVar1 * 0xc + uVar80 + 6);
  auVar102 = vpmovsxbd_avx2(auVar89);
  auVar102 = vcvtdq2ps_avx(auVar102);
  uVar78 = (ulong)(uint)((int)(uVar80 * 9) * 2);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar78 + 6);
  auVar107 = vpmovsxbd_avx2(auVar94);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar78 + uVar80 + 6);
  auVar108 = vpmovsxbd_avx2(auVar95);
  auVar108 = vcvtdq2ps_avx(auVar108);
  uVar85 = (ulong)(uint)((int)(uVar80 * 5) << 2);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar85 + 6);
  auVar100 = vpmovsxbd_avx2(auVar96);
  auVar109 = vcvtdq2ps_avx(auVar100);
  auVar120._4_4_ = fVar149;
  auVar120._0_4_ = fVar149;
  auVar120._8_4_ = fVar149;
  auVar120._12_4_ = fVar149;
  auVar120._16_4_ = fVar149;
  auVar120._20_4_ = fVar149;
  auVar120._24_4_ = fVar149;
  auVar120._28_4_ = fVar149;
  auVar122._8_4_ = 1;
  auVar122._0_8_ = 0x100000001;
  auVar122._12_4_ = 1;
  auVar122._16_4_ = 1;
  auVar122._20_4_ = 1;
  auVar122._24_4_ = 1;
  auVar122._28_4_ = 1;
  auVar98 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar112 = ZEXT1632(CONCAT412(fVar201 * auVar13._12_4_,
                                CONCAT48(fVar201 * auVar13._8_4_,
                                         CONCAT44(fVar201 * auVar13._4_4_,fVar149))));
  auVar111 = vpermps_avx2(auVar122,auVar112);
  auVar99 = vpermps_avx512vl(auVar98,auVar112);
  fVar149 = auVar99._0_4_;
  fVar217 = auVar99._4_4_;
  auVar112._4_4_ = fVar217 * auVar105._4_4_;
  auVar112._0_4_ = fVar149 * auVar105._0_4_;
  fVar218 = auVar99._8_4_;
  auVar112._8_4_ = fVar218 * auVar105._8_4_;
  fVar219 = auVar99._12_4_;
  auVar112._12_4_ = fVar219 * auVar105._12_4_;
  fVar220 = auVar99._16_4_;
  auVar112._16_4_ = fVar220 * auVar105._16_4_;
  fVar221 = auVar99._20_4_;
  auVar112._20_4_ = fVar221 * auVar105._20_4_;
  fVar222 = auVar99._24_4_;
  auVar112._24_4_ = fVar222 * auVar105._24_4_;
  auVar112._28_4_ = auVar110._28_4_;
  auVar110._4_4_ = auVar102._4_4_ * fVar217;
  auVar110._0_4_ = auVar102._0_4_ * fVar149;
  auVar110._8_4_ = auVar102._8_4_ * fVar218;
  auVar110._12_4_ = auVar102._12_4_ * fVar219;
  auVar110._16_4_ = auVar102._16_4_ * fVar220;
  auVar110._20_4_ = auVar102._20_4_ * fVar221;
  auVar110._24_4_ = auVar102._24_4_ * fVar222;
  auVar110._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar109._4_4_ * fVar217;
  auVar100._0_4_ = auVar109._0_4_ * fVar149;
  auVar100._8_4_ = auVar109._8_4_ * fVar218;
  auVar100._12_4_ = auVar109._12_4_ * fVar219;
  auVar100._16_4_ = auVar109._16_4_ * fVar220;
  auVar100._20_4_ = auVar109._20_4_ * fVar221;
  auVar100._24_4_ = auVar109._24_4_ * fVar222;
  auVar100._28_4_ = auVar99._28_4_;
  auVar90 = vfmadd231ps_fma(auVar112,auVar111,auVar101);
  auVar91 = vfmadd231ps_fma(auVar110,auVar111,auVar106);
  auVar88 = vfmadd231ps_fma(auVar100,auVar108,auVar111);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar120,auVar103);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar120,auVar104);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar107,auVar120);
  auVar121._4_4_ = fVar200;
  auVar121._0_4_ = fVar200;
  auVar121._8_4_ = fVar200;
  auVar121._12_4_ = fVar200;
  auVar121._16_4_ = fVar200;
  auVar121._20_4_ = fVar200;
  auVar121._24_4_ = fVar200;
  auVar121._28_4_ = fVar200;
  auVar100 = ZEXT1632(CONCAT412(fVar201 * auVar97._12_4_,
                                CONCAT48(fVar201 * auVar97._8_4_,
                                         CONCAT44(fVar201 * auVar97._4_4_,fVar200))));
  auVar110 = vpermps_avx2(auVar122,auVar100);
  auVar100 = vpermps_avx512vl(auVar98,auVar100);
  fVar201 = auVar100._0_4_;
  fVar149 = auVar100._4_4_;
  auVar111._4_4_ = fVar149 * auVar105._4_4_;
  auVar111._0_4_ = fVar201 * auVar105._0_4_;
  fVar217 = auVar100._8_4_;
  auVar111._8_4_ = fVar217 * auVar105._8_4_;
  fVar218 = auVar100._12_4_;
  auVar111._12_4_ = fVar218 * auVar105._12_4_;
  fVar219 = auVar100._16_4_;
  auVar111._16_4_ = fVar219 * auVar105._16_4_;
  fVar220 = auVar100._20_4_;
  auVar111._20_4_ = fVar220 * auVar105._20_4_;
  fVar221 = auVar100._24_4_;
  auVar111._24_4_ = fVar221 * auVar105._24_4_;
  auVar111._28_4_ = 1;
  auVar98._4_4_ = auVar102._4_4_ * fVar149;
  auVar98._0_4_ = auVar102._0_4_ * fVar201;
  auVar98._8_4_ = auVar102._8_4_ * fVar217;
  auVar98._12_4_ = auVar102._12_4_ * fVar218;
  auVar98._16_4_ = auVar102._16_4_ * fVar219;
  auVar98._20_4_ = auVar102._20_4_ * fVar220;
  auVar98._24_4_ = auVar102._24_4_ * fVar221;
  auVar98._28_4_ = auVar105._28_4_;
  auVar102._4_4_ = auVar109._4_4_ * fVar149;
  auVar102._0_4_ = auVar109._0_4_ * fVar201;
  auVar102._8_4_ = auVar109._8_4_ * fVar217;
  auVar102._12_4_ = auVar109._12_4_ * fVar218;
  auVar102._16_4_ = auVar109._16_4_ * fVar219;
  auVar102._20_4_ = auVar109._20_4_ * fVar220;
  auVar102._24_4_ = auVar109._24_4_ * fVar221;
  auVar102._28_4_ = auVar100._28_4_;
  auVar92 = vfmadd231ps_fma(auVar111,auVar110,auVar101);
  auVar93 = vfmadd231ps_fma(auVar98,auVar110,auVar106);
  auVar89 = vfmadd231ps_fma(auVar102,auVar110,auVar108);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar121,auVar103);
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar121,auVar104);
  auVar117._8_4_ = 0x7fffffff;
  auVar117._0_8_ = 0x7fffffff7fffffff;
  auVar117._12_4_ = 0x7fffffff;
  auVar117._16_4_ = 0x7fffffff;
  auVar117._20_4_ = 0x7fffffff;
  auVar117._24_4_ = 0x7fffffff;
  auVar117._28_4_ = 0x7fffffff;
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar121,auVar107);
  auVar103 = vandps_avx(ZEXT1632(auVar90),auVar117);
  auVar119._8_4_ = 0x219392ef;
  auVar119._0_8_ = 0x219392ef219392ef;
  auVar119._12_4_ = 0x219392ef;
  auVar119._16_4_ = 0x219392ef;
  auVar119._20_4_ = 0x219392ef;
  auVar119._24_4_ = 0x219392ef;
  auVar119._28_4_ = 0x219392ef;
  uVar78 = vcmpps_avx512vl(auVar103,auVar119,1);
  bVar5 = (bool)((byte)uVar78 & 1);
  auVar99._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar90._0_4_;
  bVar5 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar90._4_4_;
  bVar5 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar90._8_4_;
  bVar5 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar90._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(ZEXT1632(auVar91),auVar117);
  uVar78 = vcmpps_avx512vl(auVar103,auVar119,1);
  bVar5 = (bool)((byte)uVar78 & 1);
  auVar113._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar91._0_4_;
  bVar5 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar113._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar91._4_4_;
  bVar5 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar113._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar91._8_4_;
  bVar5 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar113._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar91._12_4_;
  auVar113._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar113._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar113._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar113._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(ZEXT1632(auVar88),auVar117);
  uVar78 = vcmpps_avx512vl(auVar103,auVar119,1);
  bVar5 = (bool)((byte)uVar78 & 1);
  auVar103._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar88._0_4_;
  bVar5 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar88._4_4_;
  bVar5 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar88._8_4_;
  bVar5 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar88._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar101 = vrcp14ps_avx512vl(auVar99);
  auVar118._8_4_ = 0x3f800000;
  auVar118._0_8_ = 0x3f8000003f800000;
  auVar118._12_4_ = 0x3f800000;
  auVar118._16_4_ = 0x3f800000;
  auVar118._20_4_ = 0x3f800000;
  auVar118._24_4_ = 0x3f800000;
  auVar118._28_4_ = 0x3f800000;
  auVar90 = vfnmadd213ps_fma(auVar99,auVar101,auVar118);
  auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar101,auVar101);
  auVar101 = vrcp14ps_avx512vl(auVar113);
  auVar91 = vfnmadd213ps_fma(auVar113,auVar101,auVar118);
  auVar91 = vfmadd132ps_fma(ZEXT1632(auVar91),auVar101,auVar101);
  auVar101 = vrcp14ps_avx512vl(auVar103);
  auVar88 = vfnmadd213ps_fma(auVar103,auVar101,auVar118);
  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar101,auVar101);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 7 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar92));
  auVar107._4_4_ = auVar90._4_4_ * auVar103._4_4_;
  auVar107._0_4_ = auVar90._0_4_ * auVar103._0_4_;
  auVar107._8_4_ = auVar90._8_4_ * auVar103._8_4_;
  auVar107._12_4_ = auVar90._12_4_ * auVar103._12_4_;
  auVar107._16_4_ = auVar103._16_4_ * 0.0;
  auVar107._20_4_ = auVar103._20_4_ * 0.0;
  auVar107._24_4_ = auVar103._24_4_ * 0.0;
  auVar107._28_4_ = auVar103._28_4_;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 9 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar92));
  auVar102 = vpbroadcastd_avx512vl();
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar1 * 0x10 + 6));
  auVar116._0_4_ = auVar90._0_4_ * auVar103._0_4_;
  auVar116._4_4_ = auVar90._4_4_ * auVar103._4_4_;
  auVar116._8_4_ = auVar90._8_4_ * auVar103._8_4_;
  auVar116._12_4_ = auVar90._12_4_ * auVar103._12_4_;
  auVar116._16_4_ = auVar103._16_4_ * 0.0;
  auVar116._20_4_ = auVar103._20_4_ * 0.0;
  auVar116._24_4_ = auVar103._24_4_ * 0.0;
  auVar116._28_4_ = 0;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar1 * 0x10 + uVar80 * -2 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar93));
  auVar108._4_4_ = auVar91._4_4_ * auVar103._4_4_;
  auVar108._0_4_ = auVar91._0_4_ * auVar103._0_4_;
  auVar108._8_4_ = auVar91._8_4_ * auVar103._8_4_;
  auVar108._12_4_ = auVar91._12_4_ * auVar103._12_4_;
  auVar108._16_4_ = auVar103._16_4_ * 0.0;
  auVar108._20_4_ = auVar103._20_4_ * 0.0;
  auVar108._24_4_ = auVar103._24_4_ * 0.0;
  auVar108._28_4_ = auVar103._28_4_;
  auVar103 = vcvtdq2ps_avx(auVar101);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar93));
  auVar115._0_4_ = auVar91._0_4_ * auVar103._0_4_;
  auVar115._4_4_ = auVar91._4_4_ * auVar103._4_4_;
  auVar115._8_4_ = auVar91._8_4_ * auVar103._8_4_;
  auVar115._12_4_ = auVar91._12_4_ * auVar103._12_4_;
  auVar115._16_4_ = auVar103._16_4_ * 0.0;
  auVar115._20_4_ = auVar103._20_4_ * 0.0;
  auVar115._24_4_ = auVar103._24_4_ * 0.0;
  auVar115._28_4_ = 0;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 + uVar80 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar89));
  auVar109._4_4_ = auVar103._4_4_ * auVar88._4_4_;
  auVar109._0_4_ = auVar103._0_4_ * auVar88._0_4_;
  auVar109._8_4_ = auVar103._8_4_ * auVar88._8_4_;
  auVar109._12_4_ = auVar103._12_4_ * auVar88._12_4_;
  auVar109._16_4_ = auVar103._16_4_ * 0.0;
  auVar109._20_4_ = auVar103._20_4_ * 0.0;
  auVar109._24_4_ = auVar103._24_4_ * 0.0;
  auVar109._28_4_ = auVar103._28_4_;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 0x17 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar89));
  auVar114._0_4_ = auVar88._0_4_ * auVar103._0_4_;
  auVar114._4_4_ = auVar88._4_4_ * auVar103._4_4_;
  auVar114._8_4_ = auVar88._8_4_ * auVar103._8_4_;
  auVar114._12_4_ = auVar88._12_4_ * auVar103._12_4_;
  auVar114._16_4_ = auVar103._16_4_ * 0.0;
  auVar114._20_4_ = auVar103._20_4_ * 0.0;
  auVar114._24_4_ = auVar103._24_4_ * 0.0;
  auVar114._28_4_ = 0;
  auVar103 = vpminsd_avx2(auVar107,auVar116);
  auVar101 = vpminsd_avx2(auVar108,auVar115);
  auVar103 = vmaxps_avx(auVar103,auVar101);
  auVar101 = vpminsd_avx2(auVar109,auVar114);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar105._4_4_ = uVar166;
  auVar105._0_4_ = uVar166;
  auVar105._8_4_ = uVar166;
  auVar105._12_4_ = uVar166;
  auVar105._16_4_ = uVar166;
  auVar105._20_4_ = uVar166;
  auVar105._24_4_ = uVar166;
  auVar105._28_4_ = uVar166;
  auVar101 = vmaxps_avx512vl(auVar101,auVar105);
  auVar103 = vmaxps_avx(auVar103,auVar101);
  auVar101._8_4_ = 0x3f7ffffa;
  auVar101._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar101._12_4_ = 0x3f7ffffa;
  auVar101._16_4_ = 0x3f7ffffa;
  auVar101._20_4_ = 0x3f7ffffa;
  auVar101._24_4_ = 0x3f7ffffa;
  auVar101._28_4_ = 0x3f7ffffa;
  local_340 = vmulps_avx512vl(auVar103,auVar101);
  auVar103 = vpmaxsd_avx2(auVar107,auVar116);
  auVar101 = vpmaxsd_avx2(auVar108,auVar115);
  auVar103 = vminps_avx(auVar103,auVar101);
  auVar101 = vpmaxsd_avx2(auVar109,auVar114);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar104._4_4_ = uVar166;
  auVar104._0_4_ = uVar166;
  auVar104._8_4_ = uVar166;
  auVar104._12_4_ = uVar166;
  auVar104._16_4_ = uVar166;
  auVar104._20_4_ = uVar166;
  auVar104._24_4_ = uVar166;
  auVar104._28_4_ = uVar166;
  auVar101 = vminps_avx512vl(auVar101,auVar104);
  auVar103 = vminps_avx(auVar103,auVar101);
  auVar106._8_4_ = 0x3f800003;
  auVar106._0_8_ = 0x3f8000033f800003;
  auVar106._12_4_ = 0x3f800003;
  auVar106._16_4_ = 0x3f800003;
  auVar106._20_4_ = 0x3f800003;
  auVar106._24_4_ = 0x3f800003;
  auVar106._28_4_ = 0x3f800003;
  auVar103 = vmulps_avx512vl(auVar103,auVar106);
  uVar16 = vpcmpgtd_avx512vl(auVar102,_DAT_01fe9900);
  uVar14 = vcmpps_avx512vl(local_340,auVar103,2);
  if ((byte)((byte)uVar14 & (byte)uVar16) == 0) {
    return;
  }
  local_628 = (ulong)(byte)((byte)uVar14 & (byte)uVar16);
  local_570 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_630 = prim;
LAB_01d0e680:
  lVar82 = 0;
  for (uVar78 = local_628; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
    lVar82 = lVar82 + 1;
  }
  uVar81 = *(uint *)(prim + 2);
  local_998 = (ulong)*(uint *)(prim + lVar82 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar81].ptr;
  uVar78 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_998);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar82 = *(long *)&pGVar3[1].time_range.upper;
  auVar90 = *(undefined1 (*) [16])(lVar82 + (long)p_Var4 * uVar78);
  auVar91 = *(undefined1 (*) [16])(lVar82 + (uVar78 + 1) * (long)p_Var4);
  local_628 = local_628 - 1 & local_628;
  if (local_628 != 0) {
    uVar80 = local_628 - 1 & local_628;
    for (uVar85 = local_628; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
    }
    if (uVar80 != 0) {
      for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar92 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar259._4_4_ = uVar166;
  auVar259._0_4_ = uVar166;
  auVar259._8_4_ = uVar166;
  auVar259._12_4_ = uVar166;
  local_460._16_4_ = uVar166;
  local_460._0_16_ = auVar259;
  local_460._20_4_ = uVar166;
  local_460._24_4_ = uVar166;
  local_460._28_4_ = uVar166;
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar263._4_4_ = uVar166;
  auVar263._0_4_ = uVar166;
  auVar263._8_4_ = uVar166;
  auVar263._12_4_ = uVar166;
  local_480._16_4_ = uVar166;
  local_480._0_16_ = auVar263;
  local_480._20_4_ = uVar166;
  local_480._24_4_ = uVar166;
  local_480._28_4_ = uVar166;
  auVar88 = vunpcklps_avx(auVar259,auVar263);
  fVar201 = *(float *)(ray + k * 4 + 0x60);
  auVar264._4_4_ = fVar201;
  auVar264._0_4_ = fVar201;
  auVar264._8_4_ = fVar201;
  auVar264._12_4_ = fVar201;
  fStack_490 = fVar201;
  _local_4a0 = auVar264;
  fStack_48c = fVar201;
  fStack_488 = fVar201;
  register0x0000159c = fVar201;
  local_750 = vinsertps_avx(auVar88,auVar264,0x28);
  auVar97._0_4_ = auVar90._0_4_ + auVar91._0_4_;
  auVar97._4_4_ = auVar90._4_4_ + auVar91._4_4_;
  auVar97._8_4_ = auVar90._8_4_ + auVar91._8_4_;
  auVar97._12_4_ = auVar90._12_4_ + auVar91._12_4_;
  auVar13._8_4_ = 0x3f000000;
  auVar13._0_8_ = 0x3f0000003f000000;
  auVar13._12_4_ = 0x3f000000;
  auVar88 = vmulps_avx512vl(auVar97,auVar13);
  auVar88 = vsubps_avx(auVar88,auVar92);
  auVar88 = vdpps_avx(auVar88,local_750,0x7f);
  fVar149 = *(float *)(ray + k * 4 + 0x30);
  auVar256 = ZEXT464((uint)fVar149);
  local_760 = vdpps_avx(local_750,local_750,0x7f);
  auVar258 = ZEXT1664(local_760);
  auVar236._4_12_ = ZEXT812(0) << 0x20;
  auVar236._0_4_ = local_760._0_4_;
  auVar89 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar236);
  auVar93 = vfnmadd213ss_fma(auVar89,local_760,ZEXT416(0x40000000));
  local_320 = auVar88._0_4_ * auVar89._0_4_ * auVar93._0_4_;
  auVar237._4_4_ = local_320;
  auVar237._0_4_ = local_320;
  auVar237._8_4_ = local_320;
  auVar237._12_4_ = local_320;
  fStack_730 = local_320;
  _local_740 = auVar237;
  fStack_72c = local_320;
  fStack_728 = local_320;
  fStack_724 = local_320;
  auVar88 = vfmadd231ps_fma(auVar92,local_750,auVar237);
  auVar88 = vblendps_avx(auVar88,ZEXT816(0) << 0x40,8);
  auVar90 = vsubps_avx(auVar90,auVar88);
  auVar92 = vsubps_avx(*(undefined1 (*) [16])(lVar82 + (uVar78 + 2) * (long)p_Var4),auVar88);
  auVar247 = ZEXT1664(auVar92);
  auVar91 = vsubps_avx(auVar91,auVar88);
  auVar252 = ZEXT1664(auVar91);
  auVar88 = vsubps_avx(*(undefined1 (*) [16])(lVar82 + (uVar78 + 3) * (long)p_Var4),auVar88);
  local_8e0 = vbroadcastss_avx512vl(auVar90);
  auVar265 = ZEXT3264(local_8e0);
  auVar124._8_4_ = 1;
  auVar124._0_8_ = 0x100000001;
  auVar124._12_4_ = 1;
  auVar124._16_4_ = 1;
  auVar124._20_4_ = 1;
  auVar124._24_4_ = 1;
  auVar124._28_4_ = 1;
  local_6c0 = ZEXT1632(auVar90);
  local_900 = vpermps_avx512vl(auVar124,local_6c0);
  auVar266 = ZEXT3264(local_900);
  auVar127._8_4_ = 2;
  auVar127._0_8_ = 0x200000002;
  auVar127._12_4_ = 2;
  auVar127._16_4_ = 2;
  auVar127._20_4_ = 2;
  auVar127._24_4_ = 2;
  auVar127._28_4_ = 2;
  local_7e0 = vpermps_avx512vl(auVar127,local_6c0);
  auVar267 = ZEXT3264(local_7e0);
  auVar128._8_4_ = 3;
  auVar128._0_8_ = 0x300000003;
  auVar128._12_4_ = 3;
  auVar128._16_4_ = 3;
  auVar128._20_4_ = 3;
  auVar128._24_4_ = 3;
  auVar128._28_4_ = 3;
  local_920 = vpermps_avx512vl(auVar128,local_6c0);
  auVar268 = ZEXT3264(local_920);
  local_800 = vbroadcastss_avx512vl(auVar91);
  auVar269 = ZEXT3264(local_800);
  local_700 = ZEXT1632(auVar91);
  local_940 = vpermps_avx512vl(auVar124,local_700);
  auVar270 = ZEXT3264(local_940);
  local_820 = vpermps_avx512vl(auVar127,local_700);
  auVar271 = ZEXT3264(local_820);
  local_960 = vpermps_avx512vl(auVar128,local_700);
  auVar272 = ZEXT3264(local_960);
  local_980 = vbroadcastss_avx512vl(auVar92);
  auVar273 = ZEXT3264(local_980);
  local_6e0 = ZEXT1632(auVar92);
  local_840 = vpermps_avx512vl(auVar124,local_6e0);
  auVar274 = ZEXT3264(local_840);
  local_280 = vpermps_avx512vl(auVar127,local_6e0);
  local_2a0 = vpermps_avx512vl(auVar128,local_6e0);
  local_260 = vbroadcastss_avx512vl(auVar88);
  _local_720 = ZEXT1632(auVar88);
  local_220 = vpermps_avx2(auVar124,_local_720);
  local_2e0 = vpermps_avx2(auVar127,_local_720);
  local_300 = vpermps_avx2(auVar128,_local_720);
  auVar90 = vfmadd231ps_fma(ZEXT432((uint)(fVar201 * fVar201)),local_480,local_480);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),local_460,local_460);
  local_240._0_4_ = auVar90._0_4_;
  local_240._4_4_ = local_240._0_4_;
  local_240._8_4_ = local_240._0_4_;
  local_240._12_4_ = local_240._0_4_;
  local_240._16_4_ = local_240._0_4_;
  local_240._20_4_ = local_240._0_4_;
  local_240._24_4_ = local_240._0_4_;
  local_240._28_4_ = local_240._0_4_;
  auVar123._8_4_ = 0x7fffffff;
  auVar123._0_8_ = 0x7fffffff7fffffff;
  auVar123._12_4_ = 0x7fffffff;
  auVar123._16_4_ = 0x7fffffff;
  auVar123._20_4_ = 0x7fffffff;
  auVar123._24_4_ = 0x7fffffff;
  auVar123._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_240,auVar123);
  local_670 = ZEXT416((uint)local_320);
  local_320 = fVar149 - local_320;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_550 = vpbroadcastd_avx512vl();
  iVar79 = 1;
  uVar78 = 0;
  local_560 = vpbroadcastd_avx512vl();
  auVar90 = vsqrtss_avx(local_760,local_760);
  local_984 = auVar90._0_4_;
  auVar90 = vsqrtss_avx(local_760,local_760);
  local_988 = auVar90._0_4_;
  local_3f0 = ZEXT816(0x3f80000000000000);
  auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar275 = ZEXT3264(auVar103);
  local_2c0 = local_260;
  do {
    auVar90 = vmovshdup_avx(local_3f0);
    auVar90 = vsubps_avx(auVar90,local_3f0);
    local_8c0._0_4_ = auVar90._0_4_;
    fVar200 = local_8c0._0_4_ * 0.04761905;
    uVar166 = local_3f0._0_4_;
    local_8a0._4_4_ = uVar166;
    local_8a0._0_4_ = uVar166;
    local_8a0._8_4_ = uVar166;
    local_8a0._12_4_ = uVar166;
    local_8a0._16_4_ = uVar166;
    local_8a0._20_4_ = uVar166;
    local_8a0._24_4_ = uVar166;
    local_8a0._28_4_ = uVar166;
    local_8c0._4_4_ = local_8c0._0_4_;
    local_8c0._8_4_ = local_8c0._0_4_;
    local_8c0._12_4_ = local_8c0._0_4_;
    local_8c0._16_4_ = local_8c0._0_4_;
    local_8c0._20_4_ = local_8c0._0_4_;
    local_8c0._24_4_ = local_8c0._0_4_;
    local_8c0._28_4_ = local_8c0._0_4_;
    auVar90 = vfmadd231ps_fma(local_8a0,local_8c0,_DAT_01faff20);
    auVar103 = vsubps_avx512vl(auVar275._0_32_,ZEXT1632(auVar90));
    fVar223 = auVar90._0_4_;
    fVar228 = auVar90._4_4_;
    fVar229 = auVar90._8_4_;
    fVar230 = auVar90._12_4_;
    fVar232 = auVar103._0_4_;
    fVar233 = auVar103._4_4_;
    fVar239 = auVar103._8_4_;
    fVar240 = auVar103._12_4_;
    fVar241 = auVar103._16_4_;
    fVar242 = auVar103._20_4_;
    fVar243 = auVar103._24_4_;
    auVar39._4_4_ = fVar233 * fVar233 * -fVar228;
    auVar39._0_4_ = fVar232 * fVar232 * -fVar223;
    auVar39._8_4_ = fVar239 * fVar239 * -fVar229;
    auVar39._12_4_ = fVar240 * fVar240 * -fVar230;
    auVar39._16_4_ = fVar241 * fVar241 * -0.0;
    auVar39._20_4_ = fVar242 * fVar242 * -0.0;
    auVar39._24_4_ = fVar243 * fVar243 * -0.0;
    auVar39._28_4_ = 0x80000000;
    auVar247._0_28_ =
         ZEXT1628(CONCAT412(fVar230 * fVar230,
                            CONCAT48(fVar229 * fVar229,CONCAT44(fVar228 * fVar228,fVar223 * fVar223)
                                    )));
    fVar248 = fVar223 * 3.0;
    fVar253 = fVar228 * 3.0;
    fVar254 = fVar229 * 3.0;
    fVar255 = fVar230 * 3.0;
    auVar275._28_36_ = auVar252._28_36_;
    auVar275._0_28_ = ZEXT1628(CONCAT412(fVar255,CONCAT48(fVar254,CONCAT44(fVar253,fVar248))));
    auVar178._0_4_ = (fVar248 + -5.0) * fVar223 * fVar223;
    auVar178._4_4_ = (fVar253 + -5.0) * fVar228 * fVar228;
    auVar178._8_4_ = (fVar254 + -5.0) * fVar229 * fVar229;
    auVar178._12_4_ = (fVar255 + -5.0) * fVar230 * fVar230;
    auVar178._16_4_ = 0x80000000;
    auVar178._20_4_ = 0x80000000;
    auVar178._24_4_ = 0x80000000;
    auVar178._28_4_ = 0;
    auVar104 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    auVar101 = vaddps_avx512vl(auVar178,auVar104);
    auVar257._0_4_ = fVar232 * fVar232;
    auVar257._4_4_ = fVar233 * fVar233;
    auVar257._8_4_ = fVar239 * fVar239;
    auVar257._12_4_ = fVar240 * fVar240;
    auVar257._16_4_ = fVar241 * fVar241;
    auVar257._20_4_ = fVar242 * fVar242;
    auVar257._28_36_ = auVar256._28_36_;
    auVar257._24_4_ = fVar243 * fVar243;
    auVar40._4_4_ = auVar257._4_4_ * (fVar233 * 3.0 + -5.0);
    auVar40._0_4_ = auVar257._0_4_ * (fVar232 * 3.0 + -5.0);
    auVar40._8_4_ = auVar257._8_4_ * (fVar239 * 3.0 + -5.0);
    auVar40._12_4_ = auVar257._12_4_ * (fVar240 * 3.0 + -5.0);
    auVar40._16_4_ = auVar257._16_4_ * (fVar241 * 3.0 + -5.0);
    auVar40._20_4_ = auVar257._20_4_ * (fVar242 * 3.0 + -5.0);
    auVar40._24_4_ = auVar257._24_4_ * (fVar243 * 3.0 + -5.0);
    auVar40._28_4_ = auVar258._28_4_ + -5.0;
    auVar105 = vaddps_avx512vl(auVar40,auVar104);
    fVar231 = auVar103._28_4_;
    auVar41._4_4_ = fVar228 * fVar228 * -fVar233;
    auVar41._0_4_ = fVar223 * fVar223 * -fVar232;
    auVar41._8_4_ = fVar229 * fVar229 * -fVar239;
    auVar41._12_4_ = fVar230 * fVar230 * -fVar240;
    auVar41._16_4_ = -fVar241 * 0.0 * 0.0;
    auVar41._20_4_ = -fVar242 * 0.0 * 0.0;
    auVar41._24_4_ = -fVar243 * 0.0 * 0.0;
    auVar41._28_4_ = -fVar231;
    auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar103 = vmulps_avx512vl(auVar39,auVar106);
    auVar102 = vmulps_avx512vl(auVar101,auVar106);
    auVar105 = vmulps_avx512vl(auVar105,auVar106);
    auVar107 = vmulps_avx512vl(auVar41,auVar106);
    auVar108 = vmulps_avx512vl(local_2c0,auVar107);
    fVar201 = auVar107._0_4_;
    fVar217 = auVar107._4_4_;
    auVar42._4_4_ = local_220._4_4_ * fVar217;
    auVar42._0_4_ = local_220._0_4_ * fVar201;
    fVar218 = auVar107._8_4_;
    auVar42._8_4_ = local_220._8_4_ * fVar218;
    fVar219 = auVar107._12_4_;
    auVar42._12_4_ = local_220._12_4_ * fVar219;
    fVar220 = auVar107._16_4_;
    auVar42._16_4_ = local_220._16_4_ * fVar220;
    fVar221 = auVar107._20_4_;
    auVar42._20_4_ = local_220._20_4_ * fVar221;
    fVar222 = auVar107._24_4_;
    auVar42._24_4_ = local_220._24_4_ * fVar222;
    auVar42._28_4_ = auVar101._28_4_;
    auVar43._4_4_ = local_2e0._4_4_ * fVar217;
    auVar43._0_4_ = local_2e0._0_4_ * fVar201;
    auVar43._8_4_ = local_2e0._8_4_ * fVar218;
    auVar43._12_4_ = local_2e0._12_4_ * fVar219;
    auVar43._16_4_ = local_2e0._16_4_ * fVar220;
    auVar43._20_4_ = local_2e0._20_4_ * fVar221;
    auVar43._24_4_ = local_2e0._24_4_ * fVar222;
    auVar43._28_4_ = local_220._28_4_;
    auVar44._4_4_ = local_300._4_4_ * fVar217;
    auVar44._0_4_ = local_300._0_4_ * fVar201;
    auVar44._8_4_ = local_300._8_4_ * fVar218;
    auVar44._12_4_ = local_300._12_4_ * fVar219;
    auVar44._16_4_ = local_300._16_4_ * fVar220;
    auVar44._20_4_ = local_300._20_4_ * fVar221;
    auVar44._24_4_ = local_300._24_4_ * fVar222;
    auVar44._28_4_ = auVar107._28_4_;
    auVar101 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar273._0_32_);
    auVar107 = vfmadd231ps_avx512vl(auVar42,auVar105,auVar274._0_32_);
    auVar108 = vfmadd231ps_avx512vl(auVar43,auVar105,local_280);
    auVar105 = vfmadd231ps_avx512vl(auVar44,local_2a0,auVar105);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar102,auVar269._0_32_);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar102,auVar270._0_32_);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar102,auVar271._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar272._0_32_,auVar102);
    auVar109 = vfmadd231ps_avx512vl(auVar101,auVar103,auVar265._0_32_);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,auVar266._0_32_);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar103,auVar267._0_32_);
    auVar110 = vfmadd231ps_avx512vl(auVar105,auVar268._0_32_,auVar103);
    auVar45._4_4_ = (fVar233 + fVar233) * fVar228;
    auVar45._0_4_ = (fVar232 + fVar232) * fVar223;
    auVar45._8_4_ = (fVar239 + fVar239) * fVar229;
    auVar45._12_4_ = (fVar240 + fVar240) * fVar230;
    auVar45._16_4_ = (fVar241 + fVar241) * 0.0;
    auVar45._20_4_ = (fVar242 + fVar242) * 0.0;
    auVar45._24_4_ = (fVar243 + fVar243) * 0.0;
    auVar45._28_4_ = auVar102._28_4_;
    auVar103 = vsubps_avx(auVar45,auVar257._0_32_);
    auVar226._0_28_ =
         ZEXT1628(CONCAT412((fVar230 + fVar230) * (fVar255 + -5.0) + fVar255 * fVar230,
                            CONCAT48((fVar229 + fVar229) * (fVar254 + -5.0) + fVar254 * fVar229,
                                     CONCAT44((fVar228 + fVar228) * (fVar253 + -5.0) +
                                              fVar253 * fVar228,
                                              (fVar223 + fVar223) * (fVar248 + -5.0) +
                                              fVar248 * fVar223))));
    auVar226._28_4_ = auVar252._28_4_ + -5.0 + 0.0;
    auVar101 = vaddps_avx512vl(auVar275._0_32_,auVar104);
    auVar46._4_4_ = (fVar233 + fVar233) * auVar101._4_4_;
    auVar46._0_4_ = (fVar232 + fVar232) * auVar101._0_4_;
    auVar46._8_4_ = (fVar239 + fVar239) * auVar101._8_4_;
    auVar46._12_4_ = (fVar240 + fVar240) * auVar101._12_4_;
    auVar46._16_4_ = (fVar241 + fVar241) * auVar101._16_4_;
    auVar46._20_4_ = (fVar242 + fVar242) * auVar101._20_4_;
    auVar46._24_4_ = (fVar243 + fVar243) * auVar101._24_4_;
    auVar46._28_4_ = auVar101._28_4_;
    auVar47._4_4_ = fVar233 * 3.0 * fVar233;
    auVar47._0_4_ = fVar232 * 3.0 * fVar232;
    auVar47._8_4_ = fVar239 * 3.0 * fVar239;
    auVar47._12_4_ = fVar240 * 3.0 * fVar240;
    auVar47._16_4_ = fVar241 * 3.0 * fVar241;
    auVar47._20_4_ = fVar242 * 3.0 * fVar242;
    auVar47._24_4_ = fVar243 * 3.0 * fVar243;
    auVar47._28_4_ = fVar231;
    auVar101 = vsubps_avx(auVar46,auVar47);
    auVar105 = vsubps_avx(auVar247._0_32_,auVar45);
    auVar103 = vmulps_avx512vl(auVar103,auVar106);
    auVar100 = vmulps_avx512vl(auVar226,auVar106);
    auVar101 = vmulps_avx512vl(auVar101,auVar106);
    auVar105 = vmulps_avx512vl(auVar105,auVar106);
    auVar106 = vmulps_avx512vl(local_2c0,auVar105);
    auVar111 = vmulps_avx512vl(local_220,auVar105);
    auVar48._4_4_ = local_2e0._4_4_ * auVar105._4_4_;
    auVar48._0_4_ = local_2e0._0_4_ * auVar105._0_4_;
    auVar48._8_4_ = local_2e0._8_4_ * auVar105._8_4_;
    auVar48._12_4_ = local_2e0._12_4_ * auVar105._12_4_;
    auVar48._16_4_ = local_2e0._16_4_ * auVar105._16_4_;
    auVar48._20_4_ = local_2e0._20_4_ * auVar105._20_4_;
    auVar48._24_4_ = local_2e0._24_4_ * auVar105._24_4_;
    auVar48._28_4_ = auVar258._28_4_;
    auVar49._4_4_ = local_300._4_4_ * auVar105._4_4_;
    auVar49._0_4_ = local_300._0_4_ * auVar105._0_4_;
    auVar49._8_4_ = local_300._8_4_ * auVar105._8_4_;
    auVar49._12_4_ = local_300._12_4_ * auVar105._12_4_;
    auVar49._16_4_ = local_300._16_4_ * auVar105._16_4_;
    auVar49._20_4_ = local_300._20_4_ * auVar105._20_4_;
    auVar49._24_4_ = local_300._24_4_ * auVar105._24_4_;
    auVar49._28_4_ = auVar105._28_4_;
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar101,auVar273._0_32_);
    auVar106 = vfmadd231ps_avx512vl(auVar111,auVar101,auVar274._0_32_);
    auVar111 = vfmadd231ps_avx512vl(auVar48,auVar101,local_280);
    auVar101 = vfmadd231ps_avx512vl(auVar49,local_2a0,auVar101);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar100,auVar269._0_32_);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar100,auVar270._0_32_);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar100,auVar271._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar272._0_32_,auVar100);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,auVar265._0_32_);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,auVar266._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar111,auVar103,auVar267._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar101,auVar268._0_32_,auVar103);
    auVar50._4_4_ = auVar105._4_4_ * fVar200;
    auVar50._0_4_ = auVar105._0_4_ * fVar200;
    auVar50._8_4_ = auVar105._8_4_ * fVar200;
    auVar50._12_4_ = auVar105._12_4_ * fVar200;
    auVar50._16_4_ = auVar105._16_4_ * fVar200;
    auVar50._20_4_ = auVar105._20_4_ * fVar200;
    auVar50._24_4_ = auVar105._24_4_ * fVar200;
    auVar50._28_4_ = fVar231 + fVar231;
    auVar51._4_4_ = auVar106._4_4_ * fVar200;
    auVar51._0_4_ = auVar106._0_4_ * fVar200;
    auVar51._8_4_ = auVar106._8_4_ * fVar200;
    auVar51._12_4_ = auVar106._12_4_ * fVar200;
    auVar51._16_4_ = auVar106._16_4_ * fVar200;
    auVar51._20_4_ = auVar106._20_4_ * fVar200;
    auVar51._24_4_ = auVar106._24_4_ * fVar200;
    auVar51._28_4_ = auVar102._28_4_;
    auVar52._4_4_ = auVar100._4_4_ * fVar200;
    auVar52._0_4_ = auVar100._0_4_ * fVar200;
    auVar52._8_4_ = auVar100._8_4_ * fVar200;
    auVar52._12_4_ = auVar100._12_4_ * fVar200;
    auVar52._16_4_ = auVar100._16_4_ * fVar200;
    auVar52._20_4_ = auVar100._20_4_ * fVar200;
    auVar52._24_4_ = auVar100._24_4_ * fVar200;
    auVar52._28_4_ = 0;
    fVar201 = fVar200 * auVar103._0_4_;
    fVar217 = fVar200 * auVar103._4_4_;
    auVar53._4_4_ = fVar217;
    auVar53._0_4_ = fVar201;
    fVar218 = fVar200 * auVar103._8_4_;
    auVar53._8_4_ = fVar218;
    fVar219 = fVar200 * auVar103._12_4_;
    auVar53._12_4_ = fVar219;
    fVar220 = fVar200 * auVar103._16_4_;
    auVar53._16_4_ = fVar220;
    fVar221 = fVar200 * auVar103._20_4_;
    auVar53._20_4_ = fVar221;
    fVar222 = fVar200 * auVar103._24_4_;
    auVar53._24_4_ = fVar222;
    auVar53._28_4_ = fVar200;
    auVar90 = vxorps_avx512vl(auVar104._0_16_,auVar104._0_16_);
    auVar102 = vpermt2ps_avx512vl(auVar109,_DAT_01feed00,ZEXT1632(auVar90));
    auVar100 = vpermt2ps_avx512vl(auVar107,_DAT_01feed00,ZEXT1632(auVar90));
    auVar256 = ZEXT3264(auVar100);
    auVar105 = ZEXT1632(auVar90);
    auVar111 = vpermt2ps_avx512vl(auVar108,_DAT_01feed00,auVar105);
    auVar258 = ZEXT3264(auVar111);
    auVar227._0_4_ = auVar110._0_4_ + fVar201;
    auVar227._4_4_ = auVar110._4_4_ + fVar217;
    auVar227._8_4_ = auVar110._8_4_ + fVar218;
    auVar227._12_4_ = auVar110._12_4_ + fVar219;
    auVar227._16_4_ = auVar110._16_4_ + fVar220;
    auVar227._20_4_ = auVar110._20_4_ + fVar221;
    auVar227._24_4_ = auVar110._24_4_ + fVar222;
    auVar227._28_4_ = auVar110._28_4_ + fVar200;
    auVar103 = vmaxps_avx(auVar110,auVar227);
    auVar101 = vminps_avx(auVar110,auVar227);
    auVar110 = vpermt2ps_avx512vl(auVar110,_DAT_01feed00,auVar105);
    auVar112 = vpermt2ps_avx512vl(auVar50,_DAT_01feed00,auVar105);
    auVar252 = ZEXT3264(auVar112);
    auVar98 = vpermt2ps_avx512vl(auVar51,_DAT_01feed00,auVar105);
    auVar124 = ZEXT1632(auVar90);
    auVar99 = vpermt2ps_avx512vl(auVar52,_DAT_01feed00,auVar124);
    auVar105 = vpermt2ps_avx512vl(auVar53,_DAT_01feed00,auVar124);
    auVar113 = vsubps_avx512vl(auVar110,auVar105);
    auVar105 = vsubps_avx(auVar102,auVar109);
    auVar247 = ZEXT3264(auVar105);
    auVar104 = vsubps_avx(auVar100,auVar107);
    auVar106 = vsubps_avx(auVar111,auVar108);
    auVar114 = vmulps_avx512vl(auVar104,auVar52);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar51,auVar106);
    auVar115 = vmulps_avx512vl(auVar106,auVar50);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar52,auVar105);
    auVar116 = vmulps_avx512vl(auVar105,auVar51);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar50,auVar104);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar115 = vmulps_avx512vl(auVar106,auVar106);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar104,auVar104);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar105,auVar105);
    auVar116 = vrcp14ps_avx512vl(auVar115);
    auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar275 = ZEXT3264(auVar117);
    auVar118 = vfnmadd213ps_avx512vl(auVar116,auVar115,auVar117);
    auVar116 = vfmadd132ps_avx512vl(auVar118,auVar116,auVar116);
    auVar114 = vmulps_avx512vl(auVar114,auVar116);
    auVar118 = vmulps_avx512vl(auVar104,auVar99);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar98,auVar106);
    auVar119 = vmulps_avx512vl(auVar106,auVar112);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar99,auVar105);
    auVar120 = vmulps_avx512vl(auVar105,auVar98);
    auVar120 = vfmsub231ps_avx512vl(auVar120,auVar112,auVar104);
    auVar120 = vmulps_avx512vl(auVar120,auVar120);
    auVar119 = vfmadd231ps_avx512vl(auVar120,auVar119,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar118);
    auVar116 = vmulps_avx512vl(auVar118,auVar116);
    auVar114 = vmaxps_avx512vl(auVar114,auVar116);
    auVar114 = vsqrtps_avx512vl(auVar114);
    auVar116 = vmaxps_avx512vl(auVar113,auVar110);
    auVar103 = vmaxps_avx512vl(auVar103,auVar116);
    auVar116 = vaddps_avx512vl(auVar114,auVar103);
    auVar103 = vminps_avx512vl(auVar113,auVar110);
    auVar103 = vminps_avx(auVar101,auVar103);
    auVar103 = vsubps_avx512vl(auVar103,auVar114);
    auVar216._8_4_ = 0x3f800002;
    auVar216._0_8_ = 0x3f8000023f800002;
    auVar216._12_4_ = 0x3f800002;
    auVar216._16_4_ = 0x3f800002;
    auVar216._20_4_ = 0x3f800002;
    auVar216._24_4_ = 0x3f800002;
    auVar216._28_4_ = 0x3f800002;
    auVar101 = vmulps_avx512vl(auVar116,auVar216);
    auVar27._8_4_ = 0x3f7ffffc;
    auVar27._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar27._12_4_ = 0x3f7ffffc;
    auVar27._16_4_ = 0x3f7ffffc;
    auVar27._20_4_ = 0x3f7ffffc;
    auVar27._24_4_ = 0x3f7ffffc;
    auVar27._28_4_ = 0x3f7ffffc;
    auVar103 = vmulps_avx512vl(auVar103,auVar27);
    auVar101 = vmulps_avx512vl(auVar101,auVar101);
    auVar110 = vrsqrt14ps_avx512vl(auVar115);
    auVar28._8_4_ = 0xbf000000;
    auVar28._0_8_ = 0xbf000000bf000000;
    auVar28._12_4_ = 0xbf000000;
    auVar28._16_4_ = 0xbf000000;
    auVar28._20_4_ = 0xbf000000;
    auVar28._24_4_ = 0xbf000000;
    auVar28._28_4_ = 0xbf000000;
    auVar113 = vmulps_avx512vl(auVar115,auVar28);
    fVar201 = auVar110._0_4_;
    fVar217 = auVar110._4_4_;
    fVar218 = auVar110._8_4_;
    fVar219 = auVar110._12_4_;
    fVar220 = auVar110._16_4_;
    fVar221 = auVar110._20_4_;
    fVar222 = auVar110._24_4_;
    auVar54._4_4_ = fVar217 * fVar217 * fVar217 * auVar113._4_4_;
    auVar54._0_4_ = fVar201 * fVar201 * fVar201 * auVar113._0_4_;
    auVar54._8_4_ = fVar218 * fVar218 * fVar218 * auVar113._8_4_;
    auVar54._12_4_ = fVar219 * fVar219 * fVar219 * auVar113._12_4_;
    auVar54._16_4_ = fVar220 * fVar220 * fVar220 * auVar113._16_4_;
    auVar54._20_4_ = fVar221 * fVar221 * fVar221 * auVar113._20_4_;
    auVar54._24_4_ = fVar222 * fVar222 * fVar222 * auVar113._24_4_;
    auVar54._28_4_ = auVar116._28_4_;
    auVar29._8_4_ = 0x3fc00000;
    auVar29._0_8_ = 0x3fc000003fc00000;
    auVar29._12_4_ = 0x3fc00000;
    auVar29._16_4_ = 0x3fc00000;
    auVar29._20_4_ = 0x3fc00000;
    auVar29._24_4_ = 0x3fc00000;
    auVar29._28_4_ = 0x3fc00000;
    auVar110 = vfmadd231ps_avx512vl(auVar54,auVar110,auVar29);
    auVar113 = vmulps_avx512vl(auVar105,auVar110);
    auVar114 = vmulps_avx512vl(auVar104,auVar110);
    auVar115 = vmulps_avx512vl(auVar106,auVar110);
    auVar116 = vsubps_avx512vl(auVar124,auVar109);
    auVar118 = vsubps_avx512vl(auVar124,auVar107);
    auVar119 = vsubps_avx512vl(auVar124,auVar108);
    auVar120 = vmulps_avx512vl(_local_4a0,auVar119);
    auVar120 = vfmadd231ps_avx512vl(auVar120,local_480,auVar118);
    auVar120 = vfmadd231ps_avx512vl(auVar120,local_460,auVar116);
    auVar121 = vmulps_avx512vl(auVar119,auVar119);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar118,auVar118);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar116,auVar116);
    auVar122 = vmulps_avx512vl(_local_4a0,auVar115);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar114,local_480);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar113,local_460);
    auVar115 = vmulps_avx512vl(auVar119,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar118,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar116,auVar113);
    auVar114 = vmulps_avx512vl(auVar122,auVar122);
    auVar115 = vsubps_avx512vl(local_240,auVar114);
    auVar123 = vmulps_avx512vl(auVar122,auVar113);
    auVar120 = vsubps_avx512vl(auVar120,auVar123);
    auVar120 = vaddps_avx512vl(auVar120,auVar120);
    auVar123 = vmulps_avx512vl(auVar113,auVar113);
    local_6a0 = vsubps_avx512vl(auVar121,auVar123);
    auVar101 = vsubps_avx512vl(local_6a0,auVar101);
    local_7a0 = vmulps_avx512vl(auVar120,auVar120);
    auVar30._8_4_ = 0x40800000;
    auVar30._0_8_ = 0x4080000040800000;
    auVar30._12_4_ = 0x40800000;
    auVar30._16_4_ = 0x40800000;
    auVar30._20_4_ = 0x40800000;
    auVar30._24_4_ = 0x40800000;
    auVar30._28_4_ = 0x40800000;
    _local_5a0 = vmulps_avx512vl(auVar115,auVar30);
    auVar121 = vmulps_avx512vl(_local_5a0,auVar101);
    auVar121 = vsubps_avx512vl(local_7a0,auVar121);
    uVar85 = vcmpps_avx512vl(auVar121,auVar124,5);
    bVar75 = (byte)uVar85;
    fVar201 = (float)local_740._0_4_;
    fVar217 = (float)local_740._4_4_;
    fVar218 = fStack_738;
    fVar219 = fStack_734;
    fVar220 = fStack_730;
    fVar221 = fStack_72c;
    fVar222 = fStack_728;
    fVar200 = fStack_724;
    if (bVar75 == 0) {
LAB_01d0f3aa:
      auVar265 = ZEXT3264(local_8e0);
      auVar266 = ZEXT3264(local_900);
      auVar267 = ZEXT3264(local_7e0);
      auVar268 = ZEXT3264(local_920);
      auVar269 = ZEXT3264(local_800);
      auVar270 = ZEXT3264(local_940);
      auVar271 = ZEXT3264(local_820);
      auVar272 = ZEXT3264(local_960);
      auVar273 = ZEXT3264(local_980);
      auVar274 = ZEXT3264(local_840);
    }
    else {
      auVar121 = vsqrtps_avx512vl(auVar121);
      auVar123 = vaddps_avx512vl(auVar115,auVar115);
      local_5c0 = vrcp14ps_avx512vl(auVar123);
      auVar117 = vfnmadd213ps_avx512vl(local_5c0,auVar123,auVar117);
      auVar117 = vfmadd132ps_avx512vl(auVar117,local_5c0,local_5c0);
      auVar31._8_4_ = 0x80000000;
      auVar31._0_8_ = 0x8000000080000000;
      auVar31._12_4_ = 0x80000000;
      auVar31._16_4_ = 0x80000000;
      auVar31._20_4_ = 0x80000000;
      auVar31._24_4_ = 0x80000000;
      auVar31._28_4_ = 0x80000000;
      local_5e0 = vxorps_avx512vl(auVar120,auVar31);
      auVar124 = vsubps_avx512vl(local_5e0,auVar121);
      auVar124 = vmulps_avx512vl(auVar124,auVar117);
      auVar121 = vsubps_avx512vl(auVar121,auVar120);
      local_7c0 = vmulps_avx512vl(auVar121,auVar117);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar121 = vblendmps_avx512vl(auVar117,auVar124);
      auVar125._0_4_ =
           (uint)(bVar75 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar117._0_4_;
      bVar5 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar125._4_4_ = (uint)bVar5 * auVar121._4_4_ | (uint)!bVar5 * auVar117._4_4_;
      bVar5 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar125._8_4_ = (uint)bVar5 * auVar121._8_4_ | (uint)!bVar5 * auVar117._8_4_;
      bVar5 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar125._12_4_ = (uint)bVar5 * auVar121._12_4_ | (uint)!bVar5 * auVar117._12_4_;
      bVar5 = (bool)((byte)(uVar85 >> 4) & 1);
      auVar125._16_4_ = (uint)bVar5 * auVar121._16_4_ | (uint)!bVar5 * auVar117._16_4_;
      bVar5 = (bool)((byte)(uVar85 >> 5) & 1);
      auVar125._20_4_ = (uint)bVar5 * auVar121._20_4_ | (uint)!bVar5 * auVar117._20_4_;
      bVar5 = (bool)((byte)(uVar85 >> 6) & 1);
      auVar125._24_4_ = (uint)bVar5 * auVar121._24_4_ | (uint)!bVar5 * auVar117._24_4_;
      bVar5 = SUB81(uVar85 >> 7,0);
      auVar125._28_4_ = (uint)bVar5 * auVar121._28_4_ | (uint)!bVar5 * auVar117._28_4_;
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar121 = vblendmps_avx512vl(auVar117,local_7c0);
      auVar126._0_4_ =
           (uint)(bVar75 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar117._0_4_;
      bVar5 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar126._4_4_ = (uint)bVar5 * auVar121._4_4_ | (uint)!bVar5 * auVar117._4_4_;
      bVar5 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar126._8_4_ = (uint)bVar5 * auVar121._8_4_ | (uint)!bVar5 * auVar117._8_4_;
      bVar5 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar126._12_4_ = (uint)bVar5 * auVar121._12_4_ | (uint)!bVar5 * auVar117._12_4_;
      bVar5 = (bool)((byte)(uVar85 >> 4) & 1);
      auVar126._16_4_ = (uint)bVar5 * auVar121._16_4_ | (uint)!bVar5 * auVar117._16_4_;
      bVar5 = (bool)((byte)(uVar85 >> 5) & 1);
      auVar126._20_4_ = (uint)bVar5 * auVar121._20_4_ | (uint)!bVar5 * auVar117._20_4_;
      bVar5 = (bool)((byte)(uVar85 >> 6) & 1);
      auVar126._24_4_ = (uint)bVar5 * auVar121._24_4_ | (uint)!bVar5 * auVar117._24_4_;
      bVar5 = SUB81(uVar85 >> 7,0);
      auVar126._28_4_ = (uint)bVar5 * auVar121._28_4_ | (uint)!bVar5 * auVar117._28_4_;
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar114,auVar117);
      local_600 = vmaxps_avx512vl(local_260,auVar117);
      auVar32._8_4_ = 0x36000000;
      auVar32._0_8_ = 0x3600000036000000;
      auVar32._12_4_ = 0x36000000;
      auVar32._16_4_ = 0x36000000;
      auVar32._20_4_ = 0x36000000;
      auVar32._24_4_ = 0x36000000;
      auVar32._28_4_ = 0x36000000;
      local_780 = vmulps_avx512vl(local_600,auVar32);
      vandps_avx512vl(auVar115,auVar117);
      uVar80 = vcmpps_avx512vl(local_780,local_780,1);
      uVar85 = uVar85 & uVar80;
      bVar77 = (byte)uVar85;
      if (bVar77 != 0) {
        uVar80 = vcmpps_avx512vl(auVar101,_DAT_01faff00,2);
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar115 = vblendmps_avx512vl(auVar101,auVar114);
        bVar83 = (byte)uVar80;
        uVar87 = (uint)(bVar83 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar83 & 1) * local_780._0_4_;
        bVar5 = (bool)((byte)(uVar80 >> 1) & 1);
        uVar86 = (uint)bVar5 * auVar115._4_4_ | (uint)!bVar5 * local_780._4_4_;
        bVar5 = (bool)((byte)(uVar80 >> 2) & 1);
        uVar142 = (uint)bVar5 * auVar115._8_4_ | (uint)!bVar5 * local_780._8_4_;
        bVar5 = (bool)((byte)(uVar80 >> 3) & 1);
        uVar143 = (uint)bVar5 * auVar115._12_4_ | (uint)!bVar5 * local_780._12_4_;
        bVar5 = (bool)((byte)(uVar80 >> 4) & 1);
        uVar144 = (uint)bVar5 * auVar115._16_4_ | (uint)!bVar5 * local_780._16_4_;
        bVar5 = (bool)((byte)(uVar80 >> 5) & 1);
        uVar145 = (uint)bVar5 * auVar115._20_4_ | (uint)!bVar5 * local_780._20_4_;
        bVar5 = (bool)((byte)(uVar80 >> 6) & 1);
        uVar146 = (uint)bVar5 * auVar115._24_4_ | (uint)!bVar5 * local_780._24_4_;
        bVar5 = SUB81(uVar80 >> 7,0);
        uVar147 = (uint)bVar5 * auVar115._28_4_ | (uint)!bVar5 * local_780._28_4_;
        auVar125._0_4_ = (bVar77 & 1) * uVar87 | !(bool)(bVar77 & 1) * auVar125._0_4_;
        bVar5 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar125._4_4_ = bVar5 * uVar86 | !bVar5 * auVar125._4_4_;
        bVar5 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar125._8_4_ = bVar5 * uVar142 | !bVar5 * auVar125._8_4_;
        bVar5 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar125._12_4_ = bVar5 * uVar143 | !bVar5 * auVar125._12_4_;
        bVar5 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar125._16_4_ = bVar5 * uVar144 | !bVar5 * auVar125._16_4_;
        bVar5 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar125._20_4_ = bVar5 * uVar145 | !bVar5 * auVar125._20_4_;
        bVar5 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar125._24_4_ = bVar5 * uVar146 | !bVar5 * auVar125._24_4_;
        bVar5 = SUB81(uVar85 >> 7,0);
        auVar125._28_4_ = bVar5 * uVar147 | !bVar5 * auVar125._28_4_;
        auVar101 = vblendmps_avx512vl(auVar114,auVar101);
        bVar5 = (bool)((byte)(uVar80 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar80 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar80 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar80 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar80 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar80 >> 6) & 1);
        bVar12 = SUB81(uVar80 >> 7,0);
        auVar126._0_4_ =
             (uint)(bVar77 & 1) *
             ((uint)(bVar83 & 1) * auVar101._0_4_ | !(bool)(bVar83 & 1) * uVar87) |
             !(bool)(bVar77 & 1) * auVar126._0_4_;
        bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar126._4_4_ =
             (uint)bVar6 * ((uint)bVar5 * auVar101._4_4_ | !bVar5 * uVar86) |
             !bVar6 * auVar126._4_4_;
        bVar5 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar126._8_4_ =
             (uint)bVar5 * ((uint)bVar7 * auVar101._8_4_ | !bVar7 * uVar142) |
             !bVar5 * auVar126._8_4_;
        bVar5 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar126._12_4_ =
             (uint)bVar5 * ((uint)bVar8 * auVar101._12_4_ | !bVar8 * uVar143) |
             !bVar5 * auVar126._12_4_;
        bVar5 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar126._16_4_ =
             (uint)bVar5 * ((uint)bVar9 * auVar101._16_4_ | !bVar9 * uVar144) |
             !bVar5 * auVar126._16_4_;
        bVar5 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar126._20_4_ =
             (uint)bVar5 * ((uint)bVar10 * auVar101._20_4_ | !bVar10 * uVar145) |
             !bVar5 * auVar126._20_4_;
        bVar5 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar126._24_4_ =
             (uint)bVar5 * ((uint)bVar11 * auVar101._24_4_ | !bVar11 * uVar146) |
             !bVar5 * auVar126._24_4_;
        bVar5 = SUB81(uVar85 >> 7,0);
        auVar126._28_4_ =
             (uint)bVar5 * ((uint)bVar12 * auVar101._28_4_ | !bVar12 * uVar147) |
             !bVar5 * auVar126._28_4_;
        bVar75 = (~bVar77 | bVar83) & bVar75;
      }
      if ((bVar75 & 0x7f) == 0) {
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar275 = ZEXT3264(auVar103);
        goto LAB_01d0f3aa;
      }
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar99 = vxorps_avx512vl(auVar99,auVar101);
      auVar112 = vxorps_avx512vl(auVar112,auVar101);
      uVar87 = *(uint *)(ray + k * 4 + 0x80);
      auVar98 = vxorps_avx512vl(auVar98,auVar101);
      auVar90 = vsubss_avx512f(ZEXT416(uVar87),ZEXT416((uint)local_670._0_4_));
      auVar114 = vbroadcastss_avx512vl(auVar90);
      auVar114 = vminps_avx512vl(auVar114,auVar126);
      auVar74._4_4_ = fStack_31c;
      auVar74._0_4_ = local_320;
      auVar74._8_4_ = fStack_318;
      auVar74._12_4_ = fStack_314;
      auVar74._16_4_ = fStack_310;
      auVar74._20_4_ = fStack_30c;
      auVar74._24_4_ = fStack_308;
      auVar74._28_4_ = fStack_304;
      auVar115 = vmaxps_avx512vl(auVar74,auVar125);
      auVar117 = vmulps_avx512vl(auVar119,auVar52);
      auVar117 = vfmadd213ps_avx512vl(auVar118,auVar51,auVar117);
      auVar90 = vfmadd213ps_fma(auVar116,auVar50,auVar117);
      auVar116 = vmulps_avx512vl(_local_4a0,auVar52);
      auVar116 = vfmadd231ps_avx512vl(auVar116,local_480,auVar51);
      auVar91 = vfmadd231ps_fma(auVar116,local_460,auVar50);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(ZEXT1632(auVar91),auVar116);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar14 = vcmpps_avx512vl(auVar116,auVar117,1);
      auVar118 = vxorps_avx512vl(ZEXT1632(auVar90),auVar101);
      auVar119 = vrcp14ps_avx512vl(ZEXT1632(auVar91));
      auVar216 = ZEXT1632(auVar91);
      auVar121 = vxorps_avx512vl(auVar216,auVar101);
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar128 = vfnmadd213ps_avx512vl(auVar119,auVar216,auVar127);
      auVar90 = vfmadd132ps_fma(auVar128,auVar119,auVar119);
      fVar223 = auVar90._0_4_ * auVar118._0_4_;
      fVar228 = auVar90._4_4_ * auVar118._4_4_;
      auVar55._4_4_ = fVar228;
      auVar55._0_4_ = fVar223;
      fVar229 = auVar90._8_4_ * auVar118._8_4_;
      auVar55._8_4_ = fVar229;
      fVar230 = auVar90._12_4_ * auVar118._12_4_;
      auVar55._12_4_ = fVar230;
      fVar231 = auVar118._16_4_ * 0.0;
      auVar55._16_4_ = fVar231;
      fVar232 = auVar118._20_4_ * 0.0;
      auVar55._20_4_ = fVar232;
      fVar233 = auVar118._24_4_ * 0.0;
      auVar55._24_4_ = fVar233;
      auVar55._28_4_ = auVar118._28_4_;
      uVar16 = vcmpps_avx512vl(auVar216,auVar121,1);
      bVar77 = (byte)uVar14 | (byte)uVar16;
      auVar262._8_4_ = 0xff800000;
      auVar262._0_8_ = 0xff800000ff800000;
      auVar262._12_4_ = 0xff800000;
      auVar262._16_4_ = 0xff800000;
      auVar262._20_4_ = 0xff800000;
      auVar262._24_4_ = 0xff800000;
      auVar262._28_4_ = 0xff800000;
      auVar119 = vblendmps_avx512vl(auVar55,auVar262);
      auVar129._0_4_ = (uint)(bVar77 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar77 & 1) * -0x800000;
      bVar5 = (bool)(bVar77 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar5 * auVar119._4_4_ | (uint)!bVar5 * -0x800000;
      bVar5 = (bool)(bVar77 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar5 * auVar119._8_4_ | (uint)!bVar5 * -0x800000;
      bVar5 = (bool)(bVar77 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar5 * auVar119._12_4_ | (uint)!bVar5 * -0x800000;
      bVar5 = (bool)(bVar77 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar5 * auVar119._16_4_ | (uint)!bVar5 * -0x800000;
      bVar5 = (bool)(bVar77 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar5 * auVar119._20_4_ | (uint)!bVar5 * -0x800000;
      bVar5 = (bool)(bVar77 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar5 * auVar119._24_4_ | (uint)!bVar5 * -0x800000;
      auVar129._28_4_ =
           (uint)(bVar77 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar77 >> 7) * -0x800000;
      auVar119 = vmaxps_avx512vl(auVar115,auVar129);
      uVar16 = vcmpps_avx512vl(auVar216,auVar121,6);
      bVar77 = (byte)uVar14 | (byte)uVar16;
      auVar130._0_4_ = (uint)(bVar77 & 1) * 0x7f800000 | (uint)!(bool)(bVar77 & 1) * (int)fVar223;
      bVar5 = (bool)(bVar77 >> 1 & 1);
      auVar130._4_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar228;
      bVar5 = (bool)(bVar77 >> 2 & 1);
      auVar130._8_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar229;
      bVar5 = (bool)(bVar77 >> 3 & 1);
      auVar130._12_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar230;
      bVar5 = (bool)(bVar77 >> 4 & 1);
      auVar130._16_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar231;
      bVar5 = (bool)(bVar77 >> 5 & 1);
      auVar130._20_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar232;
      bVar5 = (bool)(bVar77 >> 6 & 1);
      auVar130._24_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar233;
      auVar130._28_4_ =
           (uint)(bVar77 >> 7) * 0x7f800000 | (uint)!(bool)(bVar77 >> 7) * auVar118._28_4_;
      auVar114 = vminps_avx512vl(auVar114,auVar130);
      auVar90 = vxorps_avx512vl(auVar115._0_16_,auVar115._0_16_);
      auVar102 = vsubps_avx512vl(ZEXT1632(auVar90),auVar102);
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar90),auVar100);
      auVar115 = ZEXT1632(auVar90);
      auVar111 = vsubps_avx512vl(auVar115,auVar111);
      auVar111 = vmulps_avx512vl(auVar111,auVar99);
      auVar100 = vfmadd231ps_avx512vl(auVar111,auVar98,auVar100);
      auVar102 = vfmadd231ps_avx512vl(auVar100,auVar112,auVar102);
      auVar100 = vmulps_avx512vl(_local_4a0,auVar99);
      auVar100 = vfmadd231ps_avx512vl(auVar100,local_480,auVar98);
      auVar100 = vfmadd231ps_avx512vl(auVar100,local_460,auVar112);
      vandps_avx512vl(auVar100,auVar116);
      uVar14 = vcmpps_avx512vl(auVar100,auVar117,1);
      auVar102 = vxorps_avx512vl(auVar102,auVar101);
      auVar111 = vrcp14ps_avx512vl(auVar100);
      auVar101 = vxorps_avx512vl(auVar100,auVar101);
      auVar258 = ZEXT3264(auVar101);
      auVar112 = vfnmadd213ps_avx512vl(auVar111,auVar100,auVar127);
      auVar90 = vfmadd132ps_fma(auVar112,auVar111,auVar111);
      fVar223 = auVar90._0_4_ * auVar102._0_4_;
      fVar228 = auVar90._4_4_ * auVar102._4_4_;
      auVar56._4_4_ = fVar228;
      auVar56._0_4_ = fVar223;
      fVar229 = auVar90._8_4_ * auVar102._8_4_;
      auVar56._8_4_ = fVar229;
      fVar230 = auVar90._12_4_ * auVar102._12_4_;
      auVar56._12_4_ = fVar230;
      fVar231 = auVar102._16_4_ * 0.0;
      auVar56._16_4_ = fVar231;
      fVar232 = auVar102._20_4_ * 0.0;
      auVar56._20_4_ = fVar232;
      fVar233 = auVar102._24_4_ * 0.0;
      auVar56._24_4_ = fVar233;
      auVar56._28_4_ = auVar102._28_4_;
      uVar16 = vcmpps_avx512vl(auVar100,auVar101,1);
      bVar77 = (byte)uVar14 | (byte)uVar16;
      auVar33._8_4_ = 0xff800000;
      auVar33._0_8_ = 0xff800000ff800000;
      auVar33._12_4_ = 0xff800000;
      auVar33._16_4_ = 0xff800000;
      auVar33._20_4_ = 0xff800000;
      auVar33._24_4_ = 0xff800000;
      auVar33._28_4_ = 0xff800000;
      auVar112 = vblendmps_avx512vl(auVar56,auVar33);
      auVar131._0_4_ =
           (uint)(bVar77 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar111._0_4_;
      bVar5 = (bool)(bVar77 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar5 * auVar112._4_4_ | (uint)!bVar5 * auVar111._4_4_;
      bVar5 = (bool)(bVar77 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar5 * auVar112._8_4_ | (uint)!bVar5 * auVar111._8_4_;
      bVar5 = (bool)(bVar77 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar5 * auVar112._12_4_ | (uint)!bVar5 * auVar111._12_4_;
      bVar5 = (bool)(bVar77 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar5 * auVar112._16_4_ | (uint)!bVar5 * auVar111._16_4_;
      bVar5 = (bool)(bVar77 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar5 * auVar112._20_4_ | (uint)!bVar5 * auVar111._20_4_;
      bVar5 = (bool)(bVar77 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar5 * auVar112._24_4_ | (uint)!bVar5 * auVar111._24_4_;
      auVar131._28_4_ =
           (uint)(bVar77 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar111._28_4_;
      auVar256 = ZEXT3264(auVar131);
      _local_620 = vmaxps_avx(auVar119,auVar131);
      auVar252 = ZEXT3264(_local_620);
      uVar16 = vcmpps_avx512vl(auVar100,auVar101,6);
      bVar77 = (byte)uVar14 | (byte)uVar16;
      auVar132._0_4_ = (uint)(bVar77 & 1) * 0x7f800000 | (uint)!(bool)(bVar77 & 1) * (int)fVar223;
      bVar5 = (bool)(bVar77 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar228;
      bVar5 = (bool)(bVar77 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar229;
      bVar5 = (bool)(bVar77 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar230;
      bVar5 = (bool)(bVar77 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar231;
      bVar5 = (bool)(bVar77 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar232;
      bVar5 = (bool)(bVar77 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar233;
      auVar132._28_4_ =
           (uint)(bVar77 >> 7) * 0x7f800000 | (uint)!(bool)(bVar77 >> 7) * auVar102._28_4_;
      local_3a0 = vminps_avx(auVar114,auVar132);
      uVar14 = vcmpps_avx512vl(_local_620,local_3a0,2);
      bVar75 = bVar75 & 0x7f & (byte)uVar14;
      if (bVar75 == 0) {
        auVar275 = ZEXT3264(auVar127);
        goto LAB_01d0f3aa;
      }
      auVar101 = vmaxps_avx512vl(auVar115,auVar103);
      auVar103 = vfmadd213ps_avx512vl(auVar124,auVar122,auVar113);
      auVar103 = vmulps_avx512vl(auVar110,auVar103);
      auVar102 = vfmadd213ps_avx512vl(local_7c0,auVar122,auVar113);
      auVar57._4_4_ = auVar110._4_4_ * auVar102._4_4_;
      auVar57._0_4_ = auVar110._0_4_ * auVar102._0_4_;
      auVar57._8_4_ = auVar110._8_4_ * auVar102._8_4_;
      auVar57._12_4_ = auVar110._12_4_ * auVar102._12_4_;
      auVar57._16_4_ = auVar110._16_4_ * auVar102._16_4_;
      auVar57._20_4_ = auVar110._20_4_ * auVar102._20_4_;
      auVar57._24_4_ = auVar110._24_4_ * auVar102._24_4_;
      auVar57._28_4_ = auVar131._28_4_;
      auVar103 = vminps_avx512vl(auVar103,auVar127);
      auVar64 = ZEXT812(0);
      auVar102 = ZEXT1232(auVar64) << 0x20;
      auVar103 = vmaxps_avx(auVar103,ZEXT1232(auVar64) << 0x20);
      auVar100 = vminps_avx512vl(auVar57,auVar127);
      auVar58._4_4_ = (auVar103._4_4_ + 1.0) * 0.125;
      auVar58._0_4_ = (auVar103._0_4_ + 0.0) * 0.125;
      auVar58._8_4_ = (auVar103._8_4_ + 2.0) * 0.125;
      auVar58._12_4_ = (auVar103._12_4_ + 3.0) * 0.125;
      auVar58._16_4_ = (auVar103._16_4_ + 4.0) * 0.125;
      auVar58._20_4_ = (auVar103._20_4_ + 5.0) * 0.125;
      auVar58._24_4_ = (auVar103._24_4_ + 6.0) * 0.125;
      auVar58._28_4_ = auVar103._28_4_ + 7.0;
      auVar90 = vfmadd213ps_fma(auVar58,local_8c0,local_8a0);
      local_1a0 = ZEXT1632(auVar90);
      auVar103 = vmaxps_avx(auVar100,ZEXT1232(auVar64) << 0x20);
      auVar59._4_4_ = (auVar103._4_4_ + 1.0) * 0.125;
      auVar59._0_4_ = (auVar103._0_4_ + 0.0) * 0.125;
      auVar59._8_4_ = (auVar103._8_4_ + 2.0) * 0.125;
      auVar59._12_4_ = (auVar103._12_4_ + 3.0) * 0.125;
      auVar59._16_4_ = (auVar103._16_4_ + 4.0) * 0.125;
      auVar59._20_4_ = (auVar103._20_4_ + 5.0) * 0.125;
      auVar59._24_4_ = (auVar103._24_4_ + 6.0) * 0.125;
      auVar59._28_4_ = auVar103._28_4_ + 7.0;
      auVar90 = vfmadd213ps_fma(auVar59,local_8c0,local_8a0);
      local_1c0 = ZEXT1632(auVar90);
      auVar60._4_4_ = auVar101._4_4_ * auVar101._4_4_;
      auVar60._0_4_ = auVar101._0_4_ * auVar101._0_4_;
      auVar60._8_4_ = auVar101._8_4_ * auVar101._8_4_;
      auVar60._12_4_ = auVar101._12_4_ * auVar101._12_4_;
      auVar60._16_4_ = auVar101._16_4_ * auVar101._16_4_;
      auVar60._20_4_ = auVar101._20_4_ * auVar101._20_4_;
      auVar60._24_4_ = auVar101._24_4_ * auVar101._24_4_;
      auVar60._28_4_ = auVar101._28_4_;
      auVar103 = vsubps_avx(local_6a0,auVar60);
      auVar61._4_4_ = auVar103._4_4_ * (float)local_5a0._4_4_;
      auVar61._0_4_ = auVar103._0_4_ * (float)local_5a0._0_4_;
      auVar61._8_4_ = auVar103._8_4_ * fStack_598;
      auVar61._12_4_ = auVar103._12_4_ * fStack_594;
      auVar61._16_4_ = auVar103._16_4_ * fStack_590;
      auVar61._20_4_ = auVar103._20_4_ * fStack_58c;
      auVar61._24_4_ = auVar103._24_4_ * fStack_588;
      auVar61._28_4_ = auVar101._28_4_;
      auVar101 = vsubps_avx(local_7a0,auVar61);
      uVar85 = vcmpps_avx512vl(auVar101,ZEXT1232(auVar64) << 0x20,5);
      auVar271 = ZEXT3264(local_820);
      auVar274 = ZEXT3264(local_840);
      if ((byte)uVar85 == 0) {
        uVar85 = 0;
        auVar105 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar247 = ZEXT864(0) << 0x20;
        auVar101 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar256 = ZEXT864(0) << 0x20;
        auVar133._8_4_ = 0x7f800000;
        auVar133._0_8_ = 0x7f8000007f800000;
        auVar133._12_4_ = 0x7f800000;
        auVar133._16_4_ = 0x7f800000;
        auVar133._20_4_ = 0x7f800000;
        auVar133._24_4_ = 0x7f800000;
        auVar133._28_4_ = 0x7f800000;
        auVar134._8_4_ = 0xff800000;
        auVar134._0_8_ = 0xff800000ff800000;
        auVar134._12_4_ = 0xff800000;
        auVar134._16_4_ = 0xff800000;
        auVar134._20_4_ = 0xff800000;
        auVar134._24_4_ = 0xff800000;
        auVar134._28_4_ = 0xff800000;
      }
      else {
        uVar80 = vcmpps_avx512vl(auVar101,auVar115,5);
        auVar101 = vsqrtps_avx(auVar101);
        auVar102 = vfnmadd213ps_avx512vl(auVar123,local_5c0,auVar127);
        auVar111 = vfmadd132ps_avx512vl(auVar102,local_5c0,local_5c0);
        auVar102 = vsubps_avx(local_5e0,auVar101);
        auVar112 = vmulps_avx512vl(auVar102,auVar111);
        auVar101 = vsubps_avx512vl(auVar101,auVar120);
        auVar111 = vmulps_avx512vl(auVar101,auVar111);
        auVar101 = vfmadd213ps_avx512vl(auVar122,auVar112,auVar113);
        auVar62._4_4_ = auVar110._4_4_ * auVar101._4_4_;
        auVar62._0_4_ = auVar110._0_4_ * auVar101._0_4_;
        auVar62._8_4_ = auVar110._8_4_ * auVar101._8_4_;
        auVar62._12_4_ = auVar110._12_4_ * auVar101._12_4_;
        auVar62._16_4_ = auVar110._16_4_ * auVar101._16_4_;
        auVar62._20_4_ = auVar110._20_4_ * auVar101._20_4_;
        auVar62._24_4_ = auVar110._24_4_ * auVar101._24_4_;
        auVar62._28_4_ = auVar100._28_4_;
        auVar101 = vmulps_avx512vl(local_460,auVar112);
        auVar102 = vmulps_avx512vl(local_480,auVar112);
        auVar98 = vmulps_avx512vl(_local_4a0,auVar112);
        auVar100 = vfmadd213ps_avx512vl(auVar105,auVar62,auVar109);
        auVar101 = vsubps_avx512vl(auVar101,auVar100);
        auVar100 = vfmadd213ps_avx512vl(auVar104,auVar62,auVar107);
        auVar100 = vsubps_avx512vl(auVar102,auVar100);
        auVar90 = vfmadd213ps_fma(auVar62,auVar106,auVar108);
        auVar102 = vsubps_avx(auVar98,ZEXT1632(auVar90));
        auVar256 = ZEXT3264(auVar102);
        auVar102 = vfmadd213ps_avx512vl(auVar122,auVar111,auVar113);
        auVar110 = vmulps_avx512vl(auVar110,auVar102);
        auVar102 = vmulps_avx512vl(local_460,auVar111);
        auVar98 = vmulps_avx512vl(local_480,auVar111);
        auVar99 = vmulps_avx512vl(_local_4a0,auVar111);
        auVar90 = vfmadd213ps_fma(auVar105,auVar110,auVar109);
        auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar90));
        auVar90 = vfmadd213ps_fma(auVar104,auVar110,auVar107);
        auVar105 = vsubps_avx512vl(auVar98,ZEXT1632(auVar90));
        auVar90 = vfmadd213ps_fma(auVar106,auVar110,auVar108);
        auVar104 = vsubps_avx512vl(auVar99,ZEXT1632(auVar90));
        auVar247 = ZEXT3264(auVar104);
        auVar158._8_4_ = 0x7f800000;
        auVar158._0_8_ = 0x7f8000007f800000;
        auVar158._12_4_ = 0x7f800000;
        auVar158._16_4_ = 0x7f800000;
        auVar158._20_4_ = 0x7f800000;
        auVar158._24_4_ = 0x7f800000;
        auVar158._28_4_ = 0x7f800000;
        auVar104 = vblendmps_avx512vl(auVar158,auVar112);
        bVar5 = (bool)((byte)uVar80 & 1);
        auVar133._0_4_ = (uint)bVar5 * auVar104._0_4_ | (uint)!bVar5 * auVar109._0_4_;
        bVar5 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar5 * auVar104._4_4_ | (uint)!bVar5 * auVar109._4_4_;
        bVar5 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar5 * auVar104._8_4_ | (uint)!bVar5 * auVar109._8_4_;
        bVar5 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar5 * auVar104._12_4_ | (uint)!bVar5 * auVar109._12_4_;
        bVar5 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar133._16_4_ = (uint)bVar5 * auVar104._16_4_ | (uint)!bVar5 * auVar109._16_4_;
        bVar5 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar133._20_4_ = (uint)bVar5 * auVar104._20_4_ | (uint)!bVar5 * auVar109._20_4_;
        bVar5 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar133._24_4_ = (uint)bVar5 * auVar104._24_4_ | (uint)!bVar5 * auVar109._24_4_;
        bVar5 = SUB81(uVar80 >> 7,0);
        auVar133._28_4_ = (uint)bVar5 * auVar104._28_4_ | (uint)!bVar5 * auVar109._28_4_;
        auVar159._8_4_ = 0xff800000;
        auVar159._0_8_ = 0xff800000ff800000;
        auVar159._12_4_ = 0xff800000;
        auVar159._16_4_ = 0xff800000;
        auVar159._20_4_ = 0xff800000;
        auVar159._24_4_ = 0xff800000;
        auVar159._28_4_ = 0xff800000;
        auVar104 = vblendmps_avx512vl(auVar159,auVar111);
        bVar5 = (bool)((byte)uVar80 & 1);
        auVar134._0_4_ = (uint)bVar5 * auVar104._0_4_ | (uint)!bVar5 * -0x800000;
        bVar5 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar134._4_4_ = (uint)bVar5 * auVar104._4_4_ | (uint)!bVar5 * -0x800000;
        bVar5 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar134._8_4_ = (uint)bVar5 * auVar104._8_4_ | (uint)!bVar5 * -0x800000;
        bVar5 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar134._12_4_ = (uint)bVar5 * auVar104._12_4_ | (uint)!bVar5 * -0x800000;
        bVar5 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar134._16_4_ = (uint)bVar5 * auVar104._16_4_ | (uint)!bVar5 * -0x800000;
        bVar5 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar134._20_4_ = (uint)bVar5 * auVar104._20_4_ | (uint)!bVar5 * -0x800000;
        bVar5 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar134._24_4_ = (uint)bVar5 * auVar104._24_4_ | (uint)!bVar5 * -0x800000;
        bVar5 = SUB81(uVar80 >> 7,0);
        auVar134._28_4_ = (uint)bVar5 * auVar104._28_4_ | (uint)!bVar5 * -0x800000;
        auVar34._8_4_ = 0x36000000;
        auVar34._0_8_ = 0x3600000036000000;
        auVar34._12_4_ = 0x36000000;
        auVar34._16_4_ = 0x36000000;
        auVar34._20_4_ = 0x36000000;
        auVar34._24_4_ = 0x36000000;
        auVar34._28_4_ = 0x36000000;
        auVar104 = vmulps_avx512vl(local_600,auVar34);
        uVar15 = vcmpps_avx512vl(auVar104,local_780,0xe);
        uVar80 = uVar80 & uVar15;
        bVar77 = (byte)uVar80;
        if (bVar77 != 0) {
          uVar15 = vcmpps_avx512vl(auVar103,ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar246._8_4_ = 0x7f800000;
          auVar246._0_8_ = 0x7f8000007f800000;
          auVar246._12_4_ = 0x7f800000;
          auVar246._16_4_ = 0x7f800000;
          auVar246._20_4_ = 0x7f800000;
          auVar246._24_4_ = 0x7f800000;
          auVar246._28_4_ = 0x7f800000;
          auVar251._8_4_ = 0xff800000;
          auVar251._0_8_ = 0xff800000ff800000;
          auVar251._12_4_ = 0xff800000;
          auVar251._16_4_ = 0xff800000;
          auVar251._20_4_ = 0xff800000;
          auVar251._24_4_ = 0xff800000;
          auVar251._28_4_ = 0xff800000;
          auVar103 = vblendmps_avx512vl(auVar246,auVar251);
          bVar83 = (byte)uVar15;
          uVar86 = (uint)(bVar83 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar104._0_4_;
          bVar5 = (bool)((byte)(uVar15 >> 1) & 1);
          uVar142 = (uint)bVar5 * auVar103._4_4_ | (uint)!bVar5 * auVar104._4_4_;
          bVar5 = (bool)((byte)(uVar15 >> 2) & 1);
          uVar143 = (uint)bVar5 * auVar103._8_4_ | (uint)!bVar5 * auVar104._8_4_;
          bVar5 = (bool)((byte)(uVar15 >> 3) & 1);
          uVar144 = (uint)bVar5 * auVar103._12_4_ | (uint)!bVar5 * auVar104._12_4_;
          bVar5 = (bool)((byte)(uVar15 >> 4) & 1);
          uVar145 = (uint)bVar5 * auVar103._16_4_ | (uint)!bVar5 * auVar104._16_4_;
          bVar5 = (bool)((byte)(uVar15 >> 5) & 1);
          uVar146 = (uint)bVar5 * auVar103._20_4_ | (uint)!bVar5 * auVar104._20_4_;
          bVar5 = (bool)((byte)(uVar15 >> 6) & 1);
          uVar147 = (uint)bVar5 * auVar103._24_4_ | (uint)!bVar5 * auVar104._24_4_;
          bVar5 = SUB81(uVar15 >> 7,0);
          uVar148 = (uint)bVar5 * auVar103._28_4_ | (uint)!bVar5 * auVar104._28_4_;
          auVar133._0_4_ = (bVar77 & 1) * uVar86 | !(bool)(bVar77 & 1) * auVar133._0_4_;
          bVar5 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar133._4_4_ = bVar5 * uVar142 | !bVar5 * auVar133._4_4_;
          bVar5 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar133._8_4_ = bVar5 * uVar143 | !bVar5 * auVar133._8_4_;
          bVar5 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar133._12_4_ = bVar5 * uVar144 | !bVar5 * auVar133._12_4_;
          bVar5 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar133._16_4_ = bVar5 * uVar145 | !bVar5 * auVar133._16_4_;
          bVar5 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar133._20_4_ = bVar5 * uVar146 | !bVar5 * auVar133._20_4_;
          bVar5 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar133._24_4_ = bVar5 * uVar147 | !bVar5 * auVar133._24_4_;
          bVar5 = SUB81(uVar80 >> 7,0);
          auVar133._28_4_ = bVar5 * uVar148 | !bVar5 * auVar133._28_4_;
          auVar103 = vblendmps_avx512vl(auVar251,auVar246);
          bVar5 = (bool)((byte)(uVar15 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar15 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar15 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar15 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar15 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar15 >> 6) & 1);
          bVar12 = SUB81(uVar15 >> 7,0);
          auVar134._0_4_ =
               (uint)(bVar77 & 1) *
               ((uint)(bVar83 & 1) * auVar103._0_4_ | !(bool)(bVar83 & 1) * uVar86) |
               !(bool)(bVar77 & 1) * auVar134._0_4_;
          bVar6 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar134._4_4_ =
               (uint)bVar6 * ((uint)bVar5 * auVar103._4_4_ | !bVar5 * uVar142) |
               !bVar6 * auVar134._4_4_;
          bVar5 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar134._8_4_ =
               (uint)bVar5 * ((uint)bVar7 * auVar103._8_4_ | !bVar7 * uVar143) |
               !bVar5 * auVar134._8_4_;
          bVar5 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar134._12_4_ =
               (uint)bVar5 * ((uint)bVar8 * auVar103._12_4_ | !bVar8 * uVar144) |
               !bVar5 * auVar134._12_4_;
          bVar5 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar134._16_4_ =
               (uint)bVar5 * ((uint)bVar9 * auVar103._16_4_ | !bVar9 * uVar145) |
               !bVar5 * auVar134._16_4_;
          bVar5 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar134._20_4_ =
               (uint)bVar5 * ((uint)bVar10 * auVar103._20_4_ | !bVar10 * uVar146) |
               !bVar5 * auVar134._20_4_;
          bVar5 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar134._24_4_ =
               (uint)bVar5 * ((uint)bVar11 * auVar103._24_4_ | !bVar11 * uVar147) |
               !bVar5 * auVar134._24_4_;
          bVar5 = SUB81(uVar80 >> 7,0);
          auVar134._28_4_ =
               (uint)bVar5 * ((uint)bVar12 * auVar103._28_4_ | !bVar12 * uVar148) |
               !bVar5 * auVar134._28_4_;
          uVar85 = (ulong)(byte)((~bVar77 | bVar83) & (byte)uVar85);
        }
      }
      auVar265 = ZEXT3264(local_8e0);
      auVar266 = ZEXT3264(local_900);
      auVar268 = ZEXT3264(local_920);
      auVar270 = ZEXT3264(local_940);
      auVar272 = ZEXT3264(local_960);
      auVar273 = ZEXT3264(local_980);
      auVar258._0_4_ = (float)local_4a0._0_4_ * auVar247._0_4_;
      auVar258._4_4_ = (float)local_4a0._4_4_ * auVar247._4_4_;
      auVar258._8_4_ = fStack_498 * auVar247._8_4_;
      auVar258._12_4_ = fStack_494 * auVar247._12_4_;
      auVar258._16_4_ = fStack_490 * auVar247._16_4_;
      auVar258._20_4_ = fStack_48c * auVar247._20_4_;
      auVar258._28_36_ = auVar247._28_36_;
      auVar258._24_4_ = fStack_488 * auVar247._24_4_;
      auVar252 = ZEXT3264(local_480);
      auVar90 = vfmadd231ps_fma(auVar258._0_32_,local_480,auVar105);
      auVar247 = ZEXT3264(local_460);
      auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),local_460,auVar102);
      auVar258 = ZEXT3264(_local_620);
      _local_200 = _local_620;
      local_1e0 = vminps_avx(local_3a0,auVar133);
      auVar238._8_4_ = 0x7fffffff;
      auVar238._0_8_ = 0x7fffffff7fffffff;
      auVar238._12_4_ = 0x7fffffff;
      auVar238._16_4_ = 0x7fffffff;
      auVar238._20_4_ = 0x7fffffff;
      auVar238._24_4_ = 0x7fffffff;
      auVar238._28_4_ = 0x7fffffff;
      auVar103 = vandps_avx(ZEXT1632(auVar90),auVar238);
      auVar105 = vmaxps_avx(_local_620,auVar134);
      local_3c0 = auVar105;
      auVar161._8_4_ = 0x3e99999a;
      auVar161._0_8_ = 0x3e99999a3e99999a;
      auVar161._12_4_ = 0x3e99999a;
      auVar161._16_4_ = 0x3e99999a;
      auVar161._20_4_ = 0x3e99999a;
      auVar161._24_4_ = 0x3e99999a;
      auVar161._28_4_ = 0x3e99999a;
      uVar14 = vcmpps_avx512vl(auVar103,auVar161,1);
      local_440._0_2_ = (short)uVar14;
      uVar14 = vcmpps_avx512vl(_local_620,local_1e0,2);
      bVar77 = (byte)uVar14 & bVar75;
      uVar16 = vcmpps_avx512vl(auVar105,local_3a0,2);
      auVar267 = ZEXT3264(local_7e0);
      auVar269 = ZEXT3264(local_800);
      if ((bVar75 & ((byte)uVar16 | (byte)uVar14)) == 0) {
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar275 = ZEXT3264(auVar103);
      }
      else {
        uVar80 = CONCAT71((int7)(uVar85 >> 8),~(byte)uVar85);
        auVar63._4_4_ = (float)local_4a0._4_4_ * auVar256._4_4_;
        auVar63._0_4_ = (float)local_4a0._0_4_ * auVar256._0_4_;
        auVar63._8_4_ = fStack_498 * auVar256._8_4_;
        auVar63._12_4_ = fStack_494 * auVar256._12_4_;
        auVar63._16_4_ = fStack_490 * auVar256._16_4_;
        auVar63._20_4_ = fStack_48c * auVar256._20_4_;
        auVar63._24_4_ = fStack_488 * auVar256._24_4_;
        auVar63._28_4_ = 0x3e99999a;
        auVar90 = vfmadd213ps_fma(auVar100,local_480,auVar63);
        auVar90 = vfmadd213ps_fma(auVar101,local_460,ZEXT1632(auVar90));
        auVar103 = vandps_avx(ZEXT1632(auVar90),auVar238);
        uVar14 = vcmpps_avx512vl(auVar103,auVar161,1);
        bVar83 = (byte)uVar14 | ~(byte)uVar85;
        auVar162._8_4_ = 2;
        auVar162._0_8_ = 0x200000002;
        auVar162._12_4_ = 2;
        auVar162._16_4_ = 2;
        auVar162._20_4_ = 2;
        auVar162._24_4_ = 2;
        auVar162._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar103 = vpblendmd_avx512vl(auVar162,auVar35);
        local_360._0_4_ = (uint)(bVar83 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar83 & 1) * 2;
        bVar5 = (bool)(bVar83 >> 1 & 1);
        local_360._4_4_ = (uint)bVar5 * auVar103._4_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar83 >> 2 & 1);
        local_360._8_4_ = (uint)bVar5 * auVar103._8_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar83 >> 3 & 1);
        local_360._12_4_ = (uint)bVar5 * auVar103._12_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar83 >> 4 & 1);
        local_360._16_4_ = (uint)bVar5 * auVar103._16_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar83 >> 5 & 1);
        local_360._20_4_ = (uint)bVar5 * auVar103._20_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar83 >> 6 & 1);
        local_360._24_4_ = (uint)bVar5 * auVar103._24_4_ | (uint)!bVar5 * 2;
        local_360._28_4_ = (uint)(bVar83 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar83 >> 7) * 2;
        local_3e0 = vpbroadcastd_avx512vl();
        uVar14 = vpcmpd_avx512vl(local_3e0,local_360,5);
        bVar83 = (byte)uVar14 & bVar77;
        if (bVar83 == 0) {
          auVar164._4_4_ = uVar87;
          auVar164._0_4_ = uVar87;
          auVar164._8_4_ = uVar87;
          auVar164._12_4_ = uVar87;
          auVar164._16_4_ = uVar87;
          auVar164._20_4_ = uVar87;
          auVar164._24_4_ = uVar87;
          auVar164._28_4_ = uVar87;
        }
        else {
          local_380 = auVar105;
          local_98c = (uint)uVar80;
          auVar91 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar90 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar88 = vminps_avx(local_6e0._0_16_,local_720._0_16_);
          auVar92 = vminps_avx(auVar91,auVar88);
          auVar91 = vmaxps_avx(local_6e0._0_16_,local_720._0_16_);
          auVar88 = vmaxps_avx(auVar90,auVar91);
          auVar183._8_4_ = 0x7fffffff;
          auVar183._0_8_ = 0x7fffffff7fffffff;
          auVar183._12_4_ = 0x7fffffff;
          auVar90 = vandps_avx(auVar92,auVar183);
          auVar91 = vandps_avx(auVar88,auVar183);
          auVar90 = vmaxps_avx(auVar90,auVar91);
          auVar91 = vmovshdup_avx(auVar90);
          auVar91 = vmaxss_avx(auVar91,auVar90);
          auVar90 = vshufpd_avx(auVar90,auVar90,1);
          auVar90 = vmaxss_avx(auVar90,auVar91);
          fVar201 = auVar90._0_4_ * 1.9073486e-06;
          local_660 = vshufps_avx(auVar88,auVar88,0xff);
          local_420 = (float)local_620._0_4_ + (float)local_740._0_4_;
          fStack_41c = (float)local_620._4_4_ + (float)local_740._4_4_;
          fStack_418 = fStack_618 + fStack_738;
          fStack_414 = fStack_614 + fStack_734;
          fStack_410 = fStack_610 + fStack_730;
          fStack_40c = fStack_60c + fStack_72c;
          fStack_408 = fStack_608 + fStack_728;
          fStack_404 = fStack_604 + fStack_724;
          do {
            auVar163._8_4_ = 0x7f800000;
            auVar163._0_8_ = 0x7f8000007f800000;
            auVar163._12_4_ = 0x7f800000;
            auVar163._16_4_ = 0x7f800000;
            auVar163._20_4_ = 0x7f800000;
            auVar163._24_4_ = 0x7f800000;
            auVar163._28_4_ = 0x7f800000;
            auVar103 = vblendmps_avx512vl(auVar163,_local_620);
            auVar136._0_4_ =
                 (uint)(bVar83 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar83 & 1) * 0x7f800000;
            bVar5 = (bool)(bVar83 >> 1 & 1);
            auVar136._4_4_ = (uint)bVar5 * auVar103._4_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(bVar83 >> 2 & 1);
            auVar136._8_4_ = (uint)bVar5 * auVar103._8_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(bVar83 >> 3 & 1);
            auVar136._12_4_ = (uint)bVar5 * auVar103._12_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(bVar83 >> 4 & 1);
            auVar136._16_4_ = (uint)bVar5 * auVar103._16_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(bVar83 >> 5 & 1);
            auVar136._20_4_ = (uint)bVar5 * auVar103._20_4_ | (uint)!bVar5 * 0x7f800000;
            auVar136._24_4_ =
                 (uint)(bVar83 >> 6) * auVar103._24_4_ | (uint)!(bool)(bVar83 >> 6) * 0x7f800000;
            auVar136._28_4_ = 0x7f800000;
            auVar103 = vshufps_avx(auVar136,auVar136,0xb1);
            auVar103 = vminps_avx(auVar136,auVar103);
            auVar101 = vshufpd_avx(auVar103,auVar103,5);
            auVar103 = vminps_avx(auVar103,auVar101);
            auVar101 = vpermpd_avx2(auVar103,0x4e);
            auVar103 = vminps_avx(auVar103,auVar101);
            uVar14 = vcmpps_avx512vl(auVar136,auVar103,0);
            bVar76 = (byte)uVar14 & bVar83;
            bVar84 = bVar83;
            if (bVar76 != 0) {
              bVar84 = bVar76;
            }
            iVar18 = 0;
            for (uVar87 = (uint)bVar84; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
              iVar18 = iVar18 + 1;
            }
            fVar217 = local_988;
            auVar90 = ZEXT416(*(uint *)(local_200 + (uint)(iVar18 << 2)));
            auVar91 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar18 << 2)));
            if ((float)local_760._0_4_ < 0.0) {
              local_8a0._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar18 << 2)));
              local_8c0._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar18 << 2)));
              fVar217 = sqrtf((float)local_760._0_4_);
              auVar90 = local_8c0._0_16_;
              auVar91 = local_8a0._0_16_;
            }
            auVar90 = vinsertps_avx(auVar90,auVar91,0x10);
            lVar82 = 5;
            do {
              uVar166 = auVar90._0_4_;
              auVar150._4_4_ = uVar166;
              auVar150._0_4_ = uVar166;
              auVar150._8_4_ = uVar166;
              auVar150._12_4_ = uVar166;
              auVar91 = vfmadd132ps_fma(auVar150,ZEXT816(0) << 0x40,local_750);
              auVar88 = vmovshdup_avx(auVar90);
              fVar223 = auVar88._0_4_;
              fVar200 = 1.0 - fVar223;
              fVar218 = fVar223 * fVar223;
              auVar95 = SUB6416(ZEXT464(0x40400000),0);
              auVar94 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar93 = vfmadd213ss_fma(auVar95,auVar88,auVar94);
              auVar92 = vfmadd213ss_fma(auVar93,ZEXT416((uint)fVar218),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar89 = vfmadd213ss_fma(auVar95,ZEXT416((uint)fVar200),auVar94);
              auVar89 = vfmadd213ss_fma(auVar89,ZEXT416((uint)(fVar200 * fVar200)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar219 = fVar200 * fVar200 * -fVar223 * 0.5;
              fVar220 = auVar92._0_4_ * 0.5;
              fVar221 = auVar89._0_4_ * 0.5;
              fVar222 = fVar223 * fVar223 * -fVar200 * 0.5;
              auVar202._0_4_ = fVar222 * (float)local_720._0_4_;
              auVar202._4_4_ = fVar222 * (float)local_720._4_4_;
              auVar202._8_4_ = fVar222 * fStack_718;
              auVar202._12_4_ = fVar222 * fStack_714;
              auVar224._4_4_ = fVar221;
              auVar224._0_4_ = fVar221;
              auVar224._8_4_ = fVar221;
              auVar224._12_4_ = fVar221;
              auVar92 = vfmadd132ps_fma(auVar224,auVar202,local_6e0._0_16_);
              auVar184._4_4_ = fVar220;
              auVar184._0_4_ = fVar220;
              auVar184._8_4_ = fVar220;
              auVar184._12_4_ = fVar220;
              auVar92 = vfmadd132ps_fma(auVar184,auVar92,local_700._0_16_);
              auVar203._4_4_ = fVar219;
              auVar203._0_4_ = fVar219;
              auVar203._8_4_ = fVar219;
              auVar203._12_4_ = fVar219;
              auVar92 = vfmadd132ps_fma(auVar203,auVar92,local_6c0._0_16_);
              auVar89 = vfmadd231ss_fma(auVar94,auVar88,ZEXT416(0x41100000));
              local_5c0._0_16_ = auVar89;
              auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar88,ZEXT416(0x40800000));
              local_5e0._0_16_ = auVar89;
              auVar89 = vfmadd213ss_fma(auVar95,auVar88,ZEXT416(0xbf800000));
              local_600._0_16_ = auVar89;
              _local_5a0 = auVar92;
              auVar91 = vsubps_avx(auVar91,auVar92);
              local_8a0._0_16_ = auVar91;
              auVar91 = vdpps_avx(auVar91,auVar91,0x7f);
              local_8c0._0_16_ = auVar91;
              local_6a0._0_16_ = auVar90;
              if (auVar91._0_4_ < 0.0) {
                local_7a0._0_4_ = auVar93._0_4_;
                local_7c0._0_16_ = ZEXT416((uint)fVar200);
                local_780._0_4_ = fVar218;
                auVar252._0_4_ = sqrtf(auVar91._0_4_);
                auVar252._4_60_ = extraout_var;
                auVar93 = ZEXT416((uint)local_7a0._0_4_);
                auVar90 = auVar252._0_16_;
                auVar91 = local_7c0._0_16_;
              }
              else {
                auVar90 = vsqrtss_avx(auVar91,auVar91);
                local_780._0_4_ = fVar218;
                auVar91 = ZEXT416((uint)fVar200);
              }
              fVar218 = auVar91._0_4_;
              auVar89 = vfnmadd231ss_fma(ZEXT416((uint)(fVar223 * (fVar218 + fVar218))),auVar91,
                                         auVar91);
              auVar91 = vfmadd213ss_fma(auVar93,ZEXT416((uint)(fVar223 + fVar223)),
                                        ZEXT416((uint)(fVar223 * fVar223 * 3.0)));
              auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar88,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * fVar218 * -3.0)),
                                        ZEXT416((uint)(fVar218 + fVar218)),auVar92);
              auVar92 = vfmadd213ss_fma(ZEXT416((uint)(fVar200 * -2.0)),auVar88,
                                        ZEXT416((uint)local_780._0_4_));
              fVar218 = auVar89._0_4_ * 0.5;
              fVar219 = auVar91._0_4_ * 0.5;
              fVar220 = auVar93._0_4_ * 0.5;
              fVar221 = auVar92._0_4_ * 0.5;
              auVar204._0_4_ = fVar221 * (float)local_720._0_4_;
              auVar204._4_4_ = fVar221 * (float)local_720._4_4_;
              auVar204._8_4_ = fVar221 * fStack_718;
              auVar204._12_4_ = fVar221 * fStack_714;
              auVar185._4_4_ = fVar220;
              auVar185._0_4_ = fVar220;
              auVar185._8_4_ = fVar220;
              auVar185._12_4_ = fVar220;
              auVar91 = vfmadd132ps_fma(auVar185,auVar204,local_6e0._0_16_);
              auVar168._4_4_ = fVar219;
              auVar168._0_4_ = fVar219;
              auVar168._8_4_ = fVar219;
              auVar168._12_4_ = fVar219;
              auVar91 = vfmadd132ps_fma(auVar168,auVar91,local_700._0_16_);
              auVar260._4_4_ = fVar218;
              auVar260._0_4_ = fVar218;
              auVar260._8_4_ = fVar218;
              auVar260._12_4_ = fVar218;
              local_7a0._0_16_ = vfmadd132ps_fma(auVar260,auVar91,local_6c0._0_16_);
              local_780._0_16_ = vdpps_avx(local_7a0._0_16_,local_7a0._0_16_,0x7f);
              auVar65._12_4_ = 0;
              auVar65._0_12_ = ZEXT812(0);
              fVar218 = local_780._0_4_;
              auVar91 = vrsqrt14ss_avx512f(auVar65 << 0x20,ZEXT416((uint)fVar218));
              fVar219 = auVar91._0_4_;
              auVar92 = vrcp14ss_avx512f(auVar65 << 0x20,ZEXT416((uint)fVar218));
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar93 = vxorps_avx512vl(local_780._0_16_,auVar19);
              auVar91 = vfnmadd213ss_fma(auVar92,local_780._0_16_,SUB6416(ZEXT464(0x40000000),0));
              local_7c0._0_4_ = auVar90._0_4_;
              if (fVar218 < auVar93._0_4_) {
                fVar220 = sqrtf(fVar218);
                auVar90 = ZEXT416((uint)local_7c0._0_4_);
                auVar93 = local_7a0._0_16_;
              }
              else {
                auVar93 = vsqrtss_avx(local_780._0_16_,local_780._0_16_);
                fVar220 = auVar93._0_4_;
                auVar93 = local_7a0._0_16_;
              }
              fVar218 = fVar219 * 1.5 + fVar218 * -0.5 * fVar219 * fVar219 * fVar219;
              auVar151._0_4_ = auVar93._0_4_ * fVar218;
              auVar151._4_4_ = auVar93._4_4_ * fVar218;
              auVar151._8_4_ = auVar93._8_4_ * fVar218;
              auVar151._12_4_ = auVar93._12_4_ * fVar218;
              auVar89 = vdpps_avx(local_8a0._0_16_,auVar151,0x7f);
              fVar222 = auVar90._0_4_;
              fVar219 = auVar89._0_4_;
              auVar152._0_4_ = fVar219 * fVar219;
              auVar152._4_4_ = auVar89._4_4_ * auVar89._4_4_;
              auVar152._8_4_ = auVar89._8_4_ * auVar89._8_4_;
              auVar152._12_4_ = auVar89._12_4_ * auVar89._12_4_;
              auVar94 = vsubps_avx512vl(local_8c0._0_16_,auVar152);
              fVar221 = auVar94._0_4_;
              auVar169._4_12_ = ZEXT812(0) << 0x20;
              auVar169._0_4_ = fVar221;
              auVar95 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar169);
              auVar96 = vmulss_avx512f(auVar94,ZEXT416(0xbf000000));
              if (fVar221 < 0.0) {
                local_650 = fVar218;
                fStack_64c = fVar218;
                fStack_648 = fVar218;
                fStack_644 = fVar218;
                local_640 = auVar95;
                fVar221 = sqrtf(fVar221);
                auVar96 = ZEXT416(auVar96._0_4_);
                auVar90 = ZEXT416((uint)local_7c0._0_4_);
                auVar94 = local_640;
                auVar93 = local_7a0._0_16_;
                fVar218 = local_650;
                fVar200 = fStack_64c;
                fVar223 = fStack_648;
                fVar228 = fStack_644;
              }
              else {
                auVar94 = vsqrtss_avx(auVar94,auVar94);
                fVar221 = auVar94._0_4_;
                auVar94 = auVar95;
                fVar200 = fVar218;
                fVar223 = fVar218;
                fVar228 = fVar218;
              }
              auVar256 = ZEXT1664(local_8a0._0_16_);
              auVar265 = ZEXT3264(local_8e0);
              auVar266 = ZEXT3264(local_900);
              auVar267 = ZEXT3264(local_7e0);
              auVar268 = ZEXT3264(local_920);
              auVar269 = ZEXT3264(local_800);
              auVar270 = ZEXT3264(local_940);
              auVar271 = ZEXT3264(local_820);
              auVar272 = ZEXT3264(local_960);
              auVar273 = ZEXT3264(local_980);
              auVar274 = ZEXT3264(local_840);
              auVar170._0_4_ = (float)local_600._0_4_ * (float)local_720._0_4_;
              auVar170._4_4_ = (float)local_600._0_4_ * (float)local_720._4_4_;
              auVar170._8_4_ = (float)local_600._0_4_ * fStack_718;
              auVar170._12_4_ = (float)local_600._0_4_ * fStack_714;
              auVar186._4_4_ = local_5e0._0_4_;
              auVar186._0_4_ = local_5e0._0_4_;
              auVar186._8_4_ = local_5e0._0_4_;
              auVar186._12_4_ = local_5e0._0_4_;
              auVar13 = vfmadd132ps_fma(auVar186,auVar170,local_6e0._0_16_);
              auVar171._4_4_ = local_5c0._0_4_;
              auVar171._0_4_ = local_5c0._0_4_;
              auVar171._8_4_ = local_5c0._0_4_;
              auVar171._12_4_ = local_5c0._0_4_;
              auVar13 = vfmadd132ps_fma(auVar171,auVar13,local_700._0_16_);
              auVar88 = vfmadd213ss_fma(auVar88,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar166 = auVar88._0_4_;
              auVar187._4_4_ = uVar166;
              auVar187._0_4_ = uVar166;
              auVar187._8_4_ = uVar166;
              auVar187._12_4_ = uVar166;
              auVar88 = vfmadd132ps_fma(auVar187,auVar13,local_6c0._0_16_);
              auVar172._0_4_ = auVar88._0_4_ * (float)local_780._0_4_;
              auVar172._4_4_ = auVar88._4_4_ * (float)local_780._0_4_;
              auVar172._8_4_ = auVar88._8_4_ * (float)local_780._0_4_;
              auVar172._12_4_ = auVar88._12_4_ * (float)local_780._0_4_;
              auVar88 = vdpps_avx(auVar93,auVar88,0x7f);
              fVar229 = auVar88._0_4_;
              auVar188._0_4_ = auVar93._0_4_ * fVar229;
              auVar188._4_4_ = auVar93._4_4_ * fVar229;
              auVar188._8_4_ = auVar93._8_4_ * fVar229;
              auVar188._12_4_ = auVar93._12_4_ * fVar229;
              auVar88 = vsubps_avx(auVar172,auVar188);
              local_9e0 = auVar92._0_4_;
              local_9e0 = auVar91._0_4_ * local_9e0;
              auVar92 = vmaxss_avx(ZEXT416((uint)fVar201),
                                   ZEXT416((uint)(local_6a0._0_4_ * fVar217 * 1.9073486e-06)));
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar137._16_16_ = local_840._16_16_;
              auVar97 = vxorps_avx512vl(auVar93,auVar20);
              auVar189._0_4_ = fVar218 * auVar88._0_4_ * local_9e0;
              auVar189._4_4_ = fVar200 * auVar88._4_4_ * local_9e0;
              auVar189._8_4_ = fVar223 * auVar88._8_4_ * local_9e0;
              auVar189._12_4_ = fVar228 * auVar88._12_4_ * local_9e0;
              auVar258 = ZEXT1664(auVar151);
              auVar91 = vdpps_avx(auVar97,auVar151,0x7f);
              auVar88 = vfmadd213ss_fma(auVar90,ZEXT416((uint)fVar201),auVar92);
              auVar90 = vdpps_avx(local_8a0._0_16_,auVar189,0x7f);
              auVar13 = vfmadd213ss_fma(ZEXT416((uint)(fVar222 + 1.0)),
                                        ZEXT416((uint)(fVar201 / fVar220)),auVar88);
              fVar218 = auVar91._0_4_ + auVar90._0_4_;
              auVar90 = vdpps_avx(local_750,auVar151,0x7f);
              auVar91 = vdpps_avx(local_8a0._0_16_,auVar97,0x7f);
              auVar88 = vmulss_avx512f(auVar96,auVar94);
              fVar220 = auVar95._0_4_ * 1.5 + auVar88._0_4_ * auVar94._0_4_ * auVar94._0_4_;
              auVar88 = vdpps_avx(local_8a0._0_16_,local_750,0x7f);
              auVar95 = vfnmadd231ss_fma(auVar91,auVar89,ZEXT416((uint)fVar218));
              auVar88 = vfnmadd231ss_fma(auVar88,auVar89,auVar90);
              auVar91 = vpermilps_avx(_local_5a0,0xff);
              fVar221 = fVar221 - auVar91._0_4_;
              auVar94 = vshufps_avx(auVar93,auVar93,0xff);
              auVar91 = vfmsub213ss_fma(auVar95,ZEXT416((uint)fVar220),auVar94);
              auVar249._8_4_ = 0x80000000;
              auVar249._0_8_ = 0x8000000080000000;
              auVar249._12_4_ = 0x80000000;
              auVar252 = ZEXT1664(auVar249);
              auVar244._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
              auVar244._8_4_ = auVar91._8_4_ ^ 0x80000000;
              auVar244._12_4_ = auVar91._12_4_ ^ 0x80000000;
              auVar247 = ZEXT1664(auVar244);
              auVar88 = ZEXT416((uint)(auVar88._0_4_ * fVar220));
              auVar95 = vfmsub231ss_fma(ZEXT416((uint)(auVar90._0_4_ * auVar91._0_4_)),
                                        ZEXT416((uint)fVar218),auVar88);
              auVar91 = vinsertps_avx(auVar244,auVar88,0x1c);
              auVar234._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
              auVar234._8_4_ = auVar90._8_4_ ^ 0x80000000;
              auVar234._12_4_ = auVar90._12_4_ ^ 0x80000000;
              auVar88 = vinsertps_avx(ZEXT416((uint)fVar218),auVar234,0x10);
              auVar205._0_4_ = auVar95._0_4_;
              auVar205._4_4_ = auVar205._0_4_;
              auVar205._8_4_ = auVar205._0_4_;
              auVar205._12_4_ = auVar205._0_4_;
              auVar90 = vdivps_avx(auVar91,auVar205);
              auVar91 = vdivps_avx(auVar88,auVar205);
              auVar206._0_4_ = fVar219 * auVar90._0_4_ + fVar221 * auVar91._0_4_;
              auVar206._4_4_ = fVar219 * auVar90._4_4_ + fVar221 * auVar91._4_4_;
              auVar206._8_4_ = fVar219 * auVar90._8_4_ + fVar221 * auVar91._8_4_;
              auVar206._12_4_ = fVar219 * auVar90._12_4_ + fVar221 * auVar91._12_4_;
              auVar90 = vsubps_avx(local_6a0._0_16_,auVar206);
              auVar21._8_4_ = 0x7fffffff;
              auVar21._0_8_ = 0x7fffffff7fffffff;
              auVar21._12_4_ = 0x7fffffff;
              auVar91 = vandps_avx512vl(auVar89,auVar21);
              if (auVar91._0_4_ < auVar13._0_4_) {
                auVar91 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ + auVar92._0_4_)),local_660,
                                          ZEXT416(0x36000000));
                auVar22._8_4_ = 0x7fffffff;
                auVar22._0_8_ = 0x7fffffff7fffffff;
                auVar22._12_4_ = 0x7fffffff;
                auVar88 = vandps_avx512vl(ZEXT416((uint)fVar221),auVar22);
                if (auVar88._0_4_ < auVar91._0_4_) {
                  fVar217 = auVar90._0_4_ + (float)local_670._0_4_;
                  if ((fVar217 < fVar149) ||
                     (fVar218 = *(float *)(ray + k * 4 + 0x80), fVar218 < fVar217)) break;
                  auVar91 = vmovshdup_avx(auVar90);
                  fVar219 = auVar91._0_4_;
                  if ((fVar219 < 0.0) || (1.0 < fVar219)) break;
                  auVar66._12_4_ = 0;
                  auVar66._0_12_ = ZEXT412(0);
                  auVar137._4_12_ = ZEXT412(0);
                  auVar137._0_4_ = local_8c0._0_4_;
                  auVar91 = vrsqrt14ss_avx512f(auVar66 << 0x20,auVar137._0_16_);
                  fVar220 = auVar91._0_4_;
                  auVar91 = vmulss_avx512f(local_8c0._0_16_,ZEXT416(0xbf000000));
                  pGVar3 = (context->scene->geometries).items[uVar81].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                  fVar220 = fVar220 * 1.5 + auVar91._0_4_ * fVar220 * fVar220 * fVar220;
                  auVar207._0_4_ = local_8a0._0_4_ * fVar220;
                  auVar207._4_4_ = local_8a0._4_4_ * fVar220;
                  auVar207._8_4_ = local_8a0._8_4_ * fVar220;
                  auVar207._12_4_ = local_8a0._12_4_ * fVar220;
                  auVar89 = vfmadd213ps_fma(auVar94,auVar207,auVar93);
                  auVar91 = vshufps_avx(auVar207,auVar207,0xc9);
                  auVar88 = vshufps_avx(auVar93,auVar93,0xc9);
                  auVar208._0_4_ = auVar207._0_4_ * auVar88._0_4_;
                  auVar208._4_4_ = auVar207._4_4_ * auVar88._4_4_;
                  auVar208._8_4_ = auVar207._8_4_ * auVar88._8_4_;
                  auVar208._12_4_ = auVar207._12_4_ * auVar88._12_4_;
                  auVar92 = vfmsub231ps_fma(auVar208,auVar93,auVar91);
                  auVar91 = vshufps_avx(auVar92,auVar92,0xc9);
                  auVar88 = vshufps_avx(auVar89,auVar89,0xc9);
                  auVar92 = vshufps_avx(auVar92,auVar92,0xd2);
                  auVar153._0_4_ = auVar89._0_4_ * auVar92._0_4_;
                  auVar153._4_4_ = auVar89._4_4_ * auVar92._4_4_;
                  auVar153._8_4_ = auVar89._8_4_ * auVar92._8_4_;
                  auVar153._12_4_ = auVar89._12_4_ * auVar92._12_4_;
                  auVar91 = vfmsub231ps_fma(auVar153,auVar91,auVar88);
                  uVar166 = auVar91._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar217;
                    uVar2 = vextractps_avx(auVar91,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                    uVar2 = vextractps_avx(auVar91,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar166;
                    *(float *)(ray + k * 4 + 0xf0) = fVar219;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_998;
                    *(uint *)(ray + k * 4 + 0x120) = uVar81;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_510 = vshufps_avx(auVar90,auVar90,0x55);
                  local_540 = (RTCHitN  [16])vshufps_avx(auVar91,auVar91,0x55);
                  auStack_530 = vshufps_avx(auVar91,auVar91,0xaa);
                  local_520 = uVar166;
                  uStack_51c = uVar166;
                  uStack_518 = uVar166;
                  uStack_514 = uVar166;
                  local_500 = ZEXT416(0) << 0x20;
                  local_4f0 = local_560._0_8_;
                  uStack_4e8 = local_560._8_8_;
                  local_4e0 = local_550;
                  vpcmpeqd_avx2(ZEXT1632(local_550),ZEXT1632(local_550));
                  uStack_4cc = context->user->instID[0];
                  local_4d0 = uStack_4cc;
                  uStack_4c8 = uStack_4cc;
                  uStack_4c4 = uStack_4cc;
                  uStack_4c0 = context->user->instPrimID[0];
                  uStack_4bc = uStack_4c0;
                  uStack_4b8 = uStack_4c0;
                  uStack_4b4 = uStack_4c0;
                  *(float *)(ray + k * 4 + 0x80) = fVar217;
                  local_9b0 = local_570;
                  local_870.valid = (int *)local_9b0;
                  local_870.geometryUserPtr = pGVar3->userPtr;
                  local_870.context = context->user;
                  local_870.hit = local_540;
                  local_870.N = 4;
                  local_870.ray = (RTCRayN *)ray;
                  if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar247 = ZEXT1664(auVar244);
                    auVar252 = ZEXT1664(auVar249);
                    auVar256 = ZEXT1664(local_8a0._0_16_);
                    auVar258 = ZEXT1664(auVar151);
                    (*pGVar3->intersectionFilterN)(&local_870);
                    auVar274 = ZEXT3264(local_840);
                    auVar273 = ZEXT3264(local_980);
                    auVar272 = ZEXT3264(local_960);
                    auVar271 = ZEXT3264(local_820);
                    auVar270 = ZEXT3264(local_940);
                    auVar269 = ZEXT3264(local_800);
                    auVar268 = ZEXT3264(local_920);
                    auVar267 = ZEXT3264(local_7e0);
                    auVar266 = ZEXT3264(local_900);
                    auVar265 = ZEXT3264(local_8e0);
                  }
                  uVar85 = vptestmd_avx512vl(local_9b0,local_9b0);
                  if ((uVar85 & 0xf) != 0) {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar247 = ZEXT1664(auVar247._0_16_);
                      auVar252 = ZEXT1664(auVar252._0_16_);
                      auVar256 = ZEXT1664(auVar256._0_16_);
                      auVar258 = ZEXT1664(auVar258._0_16_);
                      (*p_Var4)(&local_870);
                      auVar274 = ZEXT3264(local_840);
                      auVar273 = ZEXT3264(local_980);
                      auVar272 = ZEXT3264(local_960);
                      auVar271 = ZEXT3264(local_820);
                      auVar270 = ZEXT3264(local_940);
                      auVar269 = ZEXT3264(local_800);
                      auVar268 = ZEXT3264(local_920);
                      auVar267 = ZEXT3264(local_7e0);
                      auVar266 = ZEXT3264(local_900);
                      auVar265 = ZEXT3264(local_8e0);
                    }
                    uVar85 = vptestmd_avx512vl(local_9b0,local_9b0);
                    uVar85 = uVar85 & 0xf;
                    bVar84 = (byte)uVar85;
                    if (bVar84 != 0) {
                      iVar69 = *(int *)(local_870.hit + 4);
                      iVar70 = *(int *)(local_870.hit + 8);
                      iVar71 = *(int *)(local_870.hit + 0xc);
                      bVar5 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar7 = SUB81(uVar85 >> 3,0);
                      *(uint *)(local_870.ray + 0xc0) =
                           (uint)(bVar84 & 1) * *(int *)local_870.hit |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_870.ray + 0xc0);
                      *(uint *)(local_870.ray + 0xc4) =
                           (uint)bVar5 * iVar69 | (uint)!bVar5 * *(int *)(local_870.ray + 0xc4);
                      *(uint *)(local_870.ray + 200) =
                           (uint)bVar6 * iVar70 | (uint)!bVar6 * *(int *)(local_870.ray + 200);
                      *(uint *)(local_870.ray + 0xcc) =
                           (uint)bVar7 * iVar71 | (uint)!bVar7 * *(int *)(local_870.ray + 0xcc);
                      iVar69 = *(int *)(local_870.hit + 0x14);
                      iVar70 = *(int *)(local_870.hit + 0x18);
                      iVar71 = *(int *)(local_870.hit + 0x1c);
                      bVar5 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar7 = SUB81(uVar85 >> 3,0);
                      *(uint *)(local_870.ray + 0xd0) =
                           (uint)(bVar84 & 1) * *(int *)(local_870.hit + 0x10) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_870.ray + 0xd0);
                      *(uint *)(local_870.ray + 0xd4) =
                           (uint)bVar5 * iVar69 | (uint)!bVar5 * *(int *)(local_870.ray + 0xd4);
                      *(uint *)(local_870.ray + 0xd8) =
                           (uint)bVar6 * iVar70 | (uint)!bVar6 * *(int *)(local_870.ray + 0xd8);
                      *(uint *)(local_870.ray + 0xdc) =
                           (uint)bVar7 * iVar71 | (uint)!bVar7 * *(int *)(local_870.ray + 0xdc);
                      iVar69 = *(int *)(local_870.hit + 0x24);
                      iVar70 = *(int *)(local_870.hit + 0x28);
                      iVar71 = *(int *)(local_870.hit + 0x2c);
                      bVar5 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar7 = SUB81(uVar85 >> 3,0);
                      *(uint *)(local_870.ray + 0xe0) =
                           (uint)(bVar84 & 1) * *(int *)(local_870.hit + 0x20) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_870.ray + 0xe0);
                      *(uint *)(local_870.ray + 0xe4) =
                           (uint)bVar5 * iVar69 | (uint)!bVar5 * *(int *)(local_870.ray + 0xe4);
                      *(uint *)(local_870.ray + 0xe8) =
                           (uint)bVar6 * iVar70 | (uint)!bVar6 * *(int *)(local_870.ray + 0xe8);
                      *(uint *)(local_870.ray + 0xec) =
                           (uint)bVar7 * iVar71 | (uint)!bVar7 * *(int *)(local_870.ray + 0xec);
                      iVar69 = *(int *)(local_870.hit + 0x34);
                      iVar70 = *(int *)(local_870.hit + 0x38);
                      iVar71 = *(int *)(local_870.hit + 0x3c);
                      bVar5 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar7 = SUB81(uVar85 >> 3,0);
                      *(uint *)(local_870.ray + 0xf0) =
                           (uint)(bVar84 & 1) * *(int *)(local_870.hit + 0x30) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_870.ray + 0xf0);
                      *(uint *)(local_870.ray + 0xf4) =
                           (uint)bVar5 * iVar69 | (uint)!bVar5 * *(int *)(local_870.ray + 0xf4);
                      *(uint *)(local_870.ray + 0xf8) =
                           (uint)bVar6 * iVar70 | (uint)!bVar6 * *(int *)(local_870.ray + 0xf8);
                      *(uint *)(local_870.ray + 0xfc) =
                           (uint)bVar7 * iVar71 | (uint)!bVar7 * *(int *)(local_870.ray + 0xfc);
                      iVar69 = *(int *)(local_870.hit + 0x44);
                      iVar70 = *(int *)(local_870.hit + 0x48);
                      iVar71 = *(int *)(local_870.hit + 0x4c);
                      bVar5 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar7 = SUB81(uVar85 >> 3,0);
                      *(uint *)(local_870.ray + 0x100) =
                           (uint)(bVar84 & 1) * *(int *)(local_870.hit + 0x40) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_870.ray + 0x100);
                      *(uint *)(local_870.ray + 0x104) =
                           (uint)bVar5 * iVar69 | (uint)!bVar5 * *(int *)(local_870.ray + 0x104);
                      *(uint *)(local_870.ray + 0x108) =
                           (uint)bVar6 * iVar70 | (uint)!bVar6 * *(int *)(local_870.ray + 0x108);
                      *(uint *)(local_870.ray + 0x10c) =
                           (uint)bVar7 * iVar71 | (uint)!bVar7 * *(int *)(local_870.ray + 0x10c);
                      auVar90 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x50));
                      *(undefined1 (*) [16])(local_870.ray + 0x110) = auVar90;
                      auVar90 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x60));
                      *(undefined1 (*) [16])(local_870.ray + 0x120) = auVar90;
                      auVar90 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x70));
                      *(undefined1 (*) [16])(local_870.ray + 0x130) = auVar90;
                      auVar90 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x80));
                      *(undefined1 (*) [16])(local_870.ray + 0x140) = auVar90;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar218;
                  break;
                }
              }
              lVar82 = lVar82 + -1;
            } while (lVar82 != 0);
            uVar166 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar164._4_4_ = uVar166;
            auVar164._0_4_ = uVar166;
            auVar164._8_4_ = uVar166;
            auVar164._12_4_ = uVar166;
            auVar164._16_4_ = uVar166;
            auVar164._20_4_ = uVar166;
            auVar164._24_4_ = uVar166;
            auVar164._28_4_ = uVar166;
            auVar72._4_4_ = fStack_41c;
            auVar72._0_4_ = local_420;
            auVar72._8_4_ = fStack_418;
            auVar72._12_4_ = fStack_414;
            auVar72._16_4_ = fStack_410;
            auVar72._20_4_ = fStack_40c;
            auVar72._24_4_ = fStack_408;
            auVar72._28_4_ = fStack_404;
            uVar14 = vcmpps_avx512vl(auVar164,auVar72,0xd);
            bVar83 = ~('\x01' << ((byte)iVar18 & 0x1f)) & bVar83 & (byte)uVar14;
          } while (bVar83 != 0);
          uVar80 = (ulong)local_98c;
          auVar105 = local_380;
        }
        bVar83 = local_440[0] | (byte)uVar80;
        auVar181._0_4_ = (float)local_740._0_4_ + auVar105._0_4_;
        auVar181._4_4_ = (float)local_740._4_4_ + auVar105._4_4_;
        auVar181._8_4_ = fStack_738 + auVar105._8_4_;
        auVar181._12_4_ = fStack_734 + auVar105._12_4_;
        auVar181._16_4_ = fStack_730 + auVar105._16_4_;
        auVar181._20_4_ = fStack_72c + auVar105._20_4_;
        auVar181._24_4_ = fStack_728 + auVar105._24_4_;
        auVar181._28_4_ = fStack_724 + auVar105._28_4_;
        uVar14 = vcmpps_avx512vl(auVar181,auVar164,2);
        bVar75 = (byte)uVar16 & bVar75 & (byte)uVar14;
        auVar182._8_4_ = 2;
        auVar182._0_8_ = 0x200000002;
        auVar182._12_4_ = 2;
        auVar182._16_4_ = 2;
        auVar182._20_4_ = 2;
        auVar182._24_4_ = 2;
        auVar182._28_4_ = 2;
        auVar36._8_4_ = 3;
        auVar36._0_8_ = 0x300000003;
        auVar36._12_4_ = 3;
        auVar36._16_4_ = 3;
        auVar36._20_4_ = 3;
        auVar36._24_4_ = 3;
        auVar36._28_4_ = 3;
        auVar103 = vpblendmd_avx512vl(auVar182,auVar36);
        auVar138._0_4_ = (uint)(bVar83 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar83 & 1) * 2;
        bVar5 = (bool)(bVar83 >> 1 & 1);
        auVar138._4_4_ = (uint)bVar5 * auVar103._4_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar83 >> 2 & 1);
        auVar138._8_4_ = (uint)bVar5 * auVar103._8_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar83 >> 3 & 1);
        auVar138._12_4_ = (uint)bVar5 * auVar103._12_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar83 >> 4 & 1);
        auVar138._16_4_ = (uint)bVar5 * auVar103._16_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar83 >> 5 & 1);
        auVar138._20_4_ = (uint)bVar5 * auVar103._20_4_ | (uint)!bVar5 * 2;
        bVar5 = (bool)(bVar83 >> 6 & 1);
        auVar138._24_4_ = (uint)bVar5 * auVar103._24_4_ | (uint)!bVar5 * 2;
        auVar138._28_4_ = (uint)(bVar83 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar83 >> 7) * 2;
        uVar14 = vpcmpd_avx512vl(local_3e0,auVar138,5);
        bVar83 = (byte)uVar14 & bVar75;
        fVar201 = (float)local_740._0_4_;
        fVar217 = (float)local_740._4_4_;
        fVar218 = fStack_738;
        fVar219 = fStack_734;
        fVar220 = fStack_730;
        fVar221 = fStack_72c;
        fVar222 = fStack_728;
        fVar200 = fStack_724;
        if (bVar83 != 0) {
          local_440 = auVar138;
          auVar91 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar90 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar88 = vminps_avx(local_6e0._0_16_,local_720._0_16_);
          auVar92 = vminps_avx(auVar91,auVar88);
          auVar91 = vmaxps_avx(local_6e0._0_16_,local_720._0_16_);
          auVar88 = vmaxps_avx(auVar90,auVar91);
          auVar190._8_4_ = 0x7fffffff;
          auVar190._0_8_ = 0x7fffffff7fffffff;
          auVar190._12_4_ = 0x7fffffff;
          auVar90 = vandps_avx(auVar92,auVar190);
          auVar91 = vandps_avx(auVar88,auVar190);
          auVar90 = vmaxps_avx(auVar90,auVar91);
          auVar91 = vmovshdup_avx(auVar90);
          auVar91 = vmaxss_avx(auVar91,auVar90);
          auVar90 = vshufpd_avx(auVar90,auVar90,1);
          auVar90 = vmaxss_avx(auVar90,auVar91);
          fVar201 = auVar90._0_4_ * 1.9073486e-06;
          local_660 = vshufps_avx(auVar88,auVar88,0xff);
          local_420 = (float)local_740._0_4_ + local_3c0._0_4_;
          fStack_41c = (float)local_740._4_4_ + local_3c0._4_4_;
          fStack_418 = fStack_738 + local_3c0._8_4_;
          fStack_414 = fStack_734 + local_3c0._12_4_;
          fStack_410 = fStack_730 + local_3c0._16_4_;
          fStack_40c = fStack_72c + local_3c0._20_4_;
          fStack_408 = fStack_728 + local_3c0._24_4_;
          fStack_404 = fStack_724 + local_3c0._28_4_;
          _local_620 = local_3c0;
          do {
            auVar165._8_4_ = 0x7f800000;
            auVar165._0_8_ = 0x7f8000007f800000;
            auVar165._12_4_ = 0x7f800000;
            auVar165._16_4_ = 0x7f800000;
            auVar165._20_4_ = 0x7f800000;
            auVar165._24_4_ = 0x7f800000;
            auVar165._28_4_ = 0x7f800000;
            auVar103 = vblendmps_avx512vl(auVar165,_local_620);
            auVar139._0_4_ =
                 (uint)(bVar83 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar83 & 1) * 0x7f800000;
            bVar5 = (bool)(bVar83 >> 1 & 1);
            auVar139._4_4_ = (uint)bVar5 * auVar103._4_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(bVar83 >> 2 & 1);
            auVar139._8_4_ = (uint)bVar5 * auVar103._8_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(bVar83 >> 3 & 1);
            auVar139._12_4_ = (uint)bVar5 * auVar103._12_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(bVar83 >> 4 & 1);
            auVar139._16_4_ = (uint)bVar5 * auVar103._16_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(bVar83 >> 5 & 1);
            auVar139._20_4_ = (uint)bVar5 * auVar103._20_4_ | (uint)!bVar5 * 0x7f800000;
            auVar139._24_4_ =
                 (uint)(bVar83 >> 6) * auVar103._24_4_ | (uint)!(bool)(bVar83 >> 6) * 0x7f800000;
            auVar139._28_4_ = 0x7f800000;
            auVar103 = vshufps_avx(auVar139,auVar139,0xb1);
            auVar103 = vminps_avx(auVar139,auVar103);
            auVar101 = vshufpd_avx(auVar103,auVar103,5);
            auVar103 = vminps_avx(auVar103,auVar101);
            auVar101 = vpermpd_avx2(auVar103,0x4e);
            auVar103 = vminps_avx(auVar103,auVar101);
            uVar14 = vcmpps_avx512vl(auVar139,auVar103,0);
            bVar76 = (byte)uVar14 & bVar83;
            bVar84 = bVar83;
            if (bVar76 != 0) {
              bVar84 = bVar76;
            }
            iVar18 = 0;
            for (uVar87 = (uint)bVar84; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
              iVar18 = iVar18 + 1;
            }
            fVar217 = local_984;
            auVar90 = ZEXT416(*(uint *)(local_3a0 + (uint)(iVar18 << 2)));
            auVar91 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar18 << 2)));
            if ((float)local_760._0_4_ < 0.0) {
              local_8a0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar18 << 2)));
              local_8c0._0_16_ = ZEXT416(*(uint *)(local_3a0 + (uint)(iVar18 << 2)));
              fVar217 = sqrtf((float)local_760._0_4_);
              auVar90 = local_8c0._0_16_;
              auVar91 = local_8a0._0_16_;
            }
            auVar90 = vinsertps_avx(auVar90,auVar91,0x10);
            lVar82 = 5;
            do {
              uVar166 = auVar90._0_4_;
              auVar154._4_4_ = uVar166;
              auVar154._0_4_ = uVar166;
              auVar154._8_4_ = uVar166;
              auVar154._12_4_ = uVar166;
              auVar91 = vfmadd132ps_fma(auVar154,ZEXT816(0) << 0x40,local_750);
              auVar88 = vmovshdup_avx(auVar90);
              fVar223 = auVar88._0_4_;
              fVar200 = 1.0 - fVar223;
              fVar218 = fVar223 * fVar223;
              auVar95 = SUB6416(ZEXT464(0x40400000),0);
              auVar94 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar93 = vfmadd213ss_fma(auVar95,auVar88,auVar94);
              auVar92 = vfmadd213ss_fma(auVar93,ZEXT416((uint)fVar218),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar89 = vfmadd213ss_fma(auVar95,ZEXT416((uint)fVar200),auVar94);
              auVar89 = vfmadd213ss_fma(auVar89,ZEXT416((uint)(fVar200 * fVar200)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar219 = fVar200 * fVar200 * -fVar223 * 0.5;
              fVar220 = auVar92._0_4_ * 0.5;
              fVar221 = auVar89._0_4_ * 0.5;
              fVar222 = fVar223 * fVar223 * -fVar200 * 0.5;
              auVar209._0_4_ = fVar222 * (float)local_720._0_4_;
              auVar209._4_4_ = fVar222 * (float)local_720._4_4_;
              auVar209._8_4_ = fVar222 * fStack_718;
              auVar209._12_4_ = fVar222 * fStack_714;
              auVar225._4_4_ = fVar221;
              auVar225._0_4_ = fVar221;
              auVar225._8_4_ = fVar221;
              auVar225._12_4_ = fVar221;
              auVar92 = vfmadd132ps_fma(auVar225,auVar209,local_6e0._0_16_);
              auVar191._4_4_ = fVar220;
              auVar191._0_4_ = fVar220;
              auVar191._8_4_ = fVar220;
              auVar191._12_4_ = fVar220;
              auVar92 = vfmadd132ps_fma(auVar191,auVar92,local_700._0_16_);
              auVar210._4_4_ = fVar219;
              auVar210._0_4_ = fVar219;
              auVar210._8_4_ = fVar219;
              auVar210._12_4_ = fVar219;
              auVar92 = vfmadd132ps_fma(auVar210,auVar92,local_6c0._0_16_);
              auVar89 = vfmadd231ss_fma(auVar94,auVar88,ZEXT416(0x41100000));
              local_5c0._0_16_ = auVar89;
              auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar88,ZEXT416(0x40800000));
              local_5e0._0_16_ = auVar89;
              auVar89 = vfmadd213ss_fma(auVar95,auVar88,ZEXT416(0xbf800000));
              local_600._0_16_ = auVar89;
              _local_5a0 = auVar92;
              auVar91 = vsubps_avx(auVar91,auVar92);
              local_8a0._0_16_ = auVar91;
              auVar91 = vdpps_avx(auVar91,auVar91,0x7f);
              local_8c0._0_16_ = auVar91;
              local_6a0._0_16_ = auVar90;
              if (auVar91._0_4_ < 0.0) {
                local_7a0._0_4_ = auVar93._0_4_;
                local_7c0._0_16_ = ZEXT416((uint)fVar200);
                local_780._0_4_ = fVar218;
                auVar256._0_4_ = sqrtf(auVar91._0_4_);
                auVar256._4_60_ = extraout_var_00;
                auVar93 = ZEXT416((uint)local_7a0._0_4_);
                auVar90 = auVar256._0_16_;
                auVar91 = local_7c0._0_16_;
              }
              else {
                auVar90 = vsqrtss_avx(auVar91,auVar91);
                local_780._0_4_ = fVar218;
                auVar91 = ZEXT416((uint)fVar200);
              }
              fVar218 = auVar91._0_4_;
              auVar89 = vfnmadd231ss_fma(ZEXT416((uint)(fVar223 * (fVar218 + fVar218))),auVar91,
                                         auVar91);
              auVar91 = vfmadd213ss_fma(auVar93,ZEXT416((uint)(fVar223 + fVar223)),
                                        ZEXT416((uint)(fVar223 * fVar223 * 3.0)));
              auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar88,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * fVar218 * -3.0)),
                                        ZEXT416((uint)(fVar218 + fVar218)),auVar92);
              auVar92 = vfmadd213ss_fma(ZEXT416((uint)(fVar200 * -2.0)),auVar88,
                                        ZEXT416((uint)local_780._0_4_));
              fVar218 = auVar89._0_4_ * 0.5;
              fVar219 = auVar91._0_4_ * 0.5;
              fVar220 = auVar93._0_4_ * 0.5;
              fVar221 = auVar92._0_4_ * 0.5;
              auVar211._0_4_ = fVar221 * (float)local_720._0_4_;
              auVar211._4_4_ = fVar221 * (float)local_720._4_4_;
              auVar211._8_4_ = fVar221 * fStack_718;
              auVar211._12_4_ = fVar221 * fStack_714;
              auVar192._4_4_ = fVar220;
              auVar192._0_4_ = fVar220;
              auVar192._8_4_ = fVar220;
              auVar192._12_4_ = fVar220;
              auVar91 = vfmadd132ps_fma(auVar192,auVar211,local_6e0._0_16_);
              auVar173._4_4_ = fVar219;
              auVar173._0_4_ = fVar219;
              auVar173._8_4_ = fVar219;
              auVar173._12_4_ = fVar219;
              auVar91 = vfmadd132ps_fma(auVar173,auVar91,local_700._0_16_);
              auVar261._4_4_ = fVar218;
              auVar261._0_4_ = fVar218;
              auVar261._8_4_ = fVar218;
              auVar261._12_4_ = fVar218;
              local_7a0._0_16_ = vfmadd132ps_fma(auVar261,auVar91,local_6c0._0_16_);
              local_780._0_16_ = vdpps_avx(local_7a0._0_16_,local_7a0._0_16_,0x7f);
              auVar67._12_4_ = 0;
              auVar67._0_12_ = ZEXT812(0);
              fVar218 = local_780._0_4_;
              auVar91 = vrsqrt14ss_avx512f(auVar67 << 0x20,ZEXT416((uint)fVar218));
              fVar219 = auVar91._0_4_;
              auVar92 = vrcp14ss_avx512f(auVar67 << 0x20,ZEXT416((uint)fVar218));
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar93 = vxorps_avx512vl(local_780._0_16_,auVar23);
              auVar91 = vfnmadd213ss_fma(auVar92,local_780._0_16_,SUB6416(ZEXT464(0x40000000),0));
              local_7c0._0_4_ = auVar90._0_4_;
              if (fVar218 < auVar93._0_4_) {
                fVar220 = sqrtf(fVar218);
                auVar90 = ZEXT416((uint)local_7c0._0_4_);
                auVar93 = local_7a0._0_16_;
              }
              else {
                auVar93 = vsqrtss_avx(local_780._0_16_,local_780._0_16_);
                fVar220 = auVar93._0_4_;
                auVar93 = local_7a0._0_16_;
              }
              fVar218 = fVar219 * 1.5 + fVar218 * -0.5 * fVar219 * fVar219 * fVar219;
              auVar155._0_4_ = auVar93._0_4_ * fVar218;
              auVar155._4_4_ = auVar93._4_4_ * fVar218;
              auVar155._8_4_ = auVar93._8_4_ * fVar218;
              auVar155._12_4_ = auVar93._12_4_ * fVar218;
              auVar89 = vdpps_avx(local_8a0._0_16_,auVar155,0x7f);
              fVar222 = auVar90._0_4_;
              fVar219 = auVar89._0_4_;
              auVar156._0_4_ = fVar219 * fVar219;
              auVar156._4_4_ = auVar89._4_4_ * auVar89._4_4_;
              auVar156._8_4_ = auVar89._8_4_ * auVar89._8_4_;
              auVar156._12_4_ = auVar89._12_4_ * auVar89._12_4_;
              auVar94 = vsubps_avx512vl(local_8c0._0_16_,auVar156);
              fVar221 = auVar94._0_4_;
              auVar174._4_12_ = ZEXT812(0) << 0x20;
              auVar174._0_4_ = fVar221;
              auVar95 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
              auVar96 = vmulss_avx512f(auVar94,ZEXT416(0xbf000000));
              if (fVar221 < 0.0) {
                local_650 = fVar218;
                fStack_64c = fVar218;
                fStack_648 = fVar218;
                fStack_644 = fVar218;
                local_640 = auVar95;
                fVar221 = sqrtf(fVar221);
                auVar96 = ZEXT416(auVar96._0_4_);
                auVar90 = ZEXT416((uint)local_7c0._0_4_);
                auVar94 = local_640;
                auVar93 = local_7a0._0_16_;
                fVar218 = local_650;
                fVar200 = fStack_64c;
                fVar223 = fStack_648;
                fVar228 = fStack_644;
              }
              else {
                auVar94 = vsqrtss_avx(auVar94,auVar94);
                fVar221 = auVar94._0_4_;
                auVar94 = auVar95;
                fVar200 = fVar218;
                fVar223 = fVar218;
                fVar228 = fVar218;
              }
              auVar256 = ZEXT1664(local_8a0._0_16_);
              auVar265 = ZEXT3264(local_8e0);
              auVar266 = ZEXT3264(local_900);
              auVar267 = ZEXT3264(local_7e0);
              auVar268 = ZEXT3264(local_920);
              auVar269 = ZEXT3264(local_800);
              auVar270 = ZEXT3264(local_940);
              auVar271 = ZEXT3264(local_820);
              auVar272 = ZEXT3264(local_960);
              auVar273 = ZEXT3264(local_980);
              auVar274 = ZEXT3264(local_840);
              auVar175._0_4_ = (float)local_600._0_4_ * (float)local_720._0_4_;
              auVar175._4_4_ = (float)local_600._0_4_ * (float)local_720._4_4_;
              auVar175._8_4_ = (float)local_600._0_4_ * fStack_718;
              auVar175._12_4_ = (float)local_600._0_4_ * fStack_714;
              auVar193._4_4_ = local_5e0._0_4_;
              auVar193._0_4_ = local_5e0._0_4_;
              auVar193._8_4_ = local_5e0._0_4_;
              auVar193._12_4_ = local_5e0._0_4_;
              auVar13 = vfmadd132ps_fma(auVar193,auVar175,local_6e0._0_16_);
              auVar176._4_4_ = local_5c0._0_4_;
              auVar176._0_4_ = local_5c0._0_4_;
              auVar176._8_4_ = local_5c0._0_4_;
              auVar176._12_4_ = local_5c0._0_4_;
              auVar13 = vfmadd132ps_fma(auVar176,auVar13,local_700._0_16_);
              auVar88 = vfmadd213ss_fma(auVar88,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar166 = auVar88._0_4_;
              auVar194._4_4_ = uVar166;
              auVar194._0_4_ = uVar166;
              auVar194._8_4_ = uVar166;
              auVar194._12_4_ = uVar166;
              auVar88 = vfmadd132ps_fma(auVar194,auVar13,local_6c0._0_16_);
              auVar177._0_4_ = auVar88._0_4_ * (float)local_780._0_4_;
              auVar177._4_4_ = auVar88._4_4_ * (float)local_780._0_4_;
              auVar177._8_4_ = auVar88._8_4_ * (float)local_780._0_4_;
              auVar177._12_4_ = auVar88._12_4_ * (float)local_780._0_4_;
              auVar88 = vdpps_avx(auVar93,auVar88,0x7f);
              fVar229 = auVar88._0_4_;
              auVar195._0_4_ = auVar93._0_4_ * fVar229;
              auVar195._4_4_ = auVar93._4_4_ * fVar229;
              auVar195._8_4_ = auVar93._8_4_ * fVar229;
              auVar195._12_4_ = auVar93._12_4_ * fVar229;
              auVar88 = vsubps_avx(auVar177,auVar195);
              local_9e0 = auVar92._0_4_;
              local_9e0 = auVar91._0_4_ * local_9e0;
              auVar92 = vmaxss_avx(ZEXT416((uint)fVar201),
                                   ZEXT416((uint)(local_6a0._0_4_ * fVar217 * 1.9073486e-06)));
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar140._16_16_ = local_840._16_16_;
              auVar97 = vxorps_avx512vl(auVar93,auVar24);
              auVar196._0_4_ = fVar218 * auVar88._0_4_ * local_9e0;
              auVar196._4_4_ = fVar200 * auVar88._4_4_ * local_9e0;
              auVar196._8_4_ = fVar223 * auVar88._8_4_ * local_9e0;
              auVar196._12_4_ = fVar228 * auVar88._12_4_ * local_9e0;
              auVar258 = ZEXT1664(auVar155);
              auVar91 = vdpps_avx(auVar97,auVar155,0x7f);
              auVar88 = vfmadd213ss_fma(auVar90,ZEXT416((uint)fVar201),auVar92);
              auVar90 = vdpps_avx(local_8a0._0_16_,auVar196,0x7f);
              auVar13 = vfmadd213ss_fma(ZEXT416((uint)(fVar222 + 1.0)),
                                        ZEXT416((uint)(fVar201 / fVar220)),auVar88);
              fVar218 = auVar91._0_4_ + auVar90._0_4_;
              auVar90 = vdpps_avx(local_750,auVar155,0x7f);
              auVar91 = vdpps_avx(local_8a0._0_16_,auVar97,0x7f);
              auVar88 = vmulss_avx512f(auVar96,auVar94);
              fVar220 = auVar95._0_4_ * 1.5 + auVar88._0_4_ * auVar94._0_4_ * auVar94._0_4_;
              auVar88 = vdpps_avx(local_8a0._0_16_,local_750,0x7f);
              auVar95 = vfnmadd231ss_fma(auVar91,auVar89,ZEXT416((uint)fVar218));
              auVar88 = vfnmadd231ss_fma(auVar88,auVar89,auVar90);
              auVar91 = vpermilps_avx(_local_5a0,0xff);
              fVar221 = fVar221 - auVar91._0_4_;
              auVar94 = vshufps_avx(auVar93,auVar93,0xff);
              auVar91 = vfmsub213ss_fma(auVar95,ZEXT416((uint)fVar220),auVar94);
              auVar250._8_4_ = 0x80000000;
              auVar250._0_8_ = 0x8000000080000000;
              auVar250._12_4_ = 0x80000000;
              auVar252 = ZEXT1664(auVar250);
              auVar245._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
              auVar245._8_4_ = auVar91._8_4_ ^ 0x80000000;
              auVar245._12_4_ = auVar91._12_4_ ^ 0x80000000;
              auVar247 = ZEXT1664(auVar245);
              auVar88 = ZEXT416((uint)(auVar88._0_4_ * fVar220));
              auVar95 = vfmsub231ss_fma(ZEXT416((uint)(auVar90._0_4_ * auVar91._0_4_)),
                                        ZEXT416((uint)fVar218),auVar88);
              auVar91 = vinsertps_avx(auVar245,auVar88,0x1c);
              auVar235._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
              auVar235._8_4_ = auVar90._8_4_ ^ 0x80000000;
              auVar235._12_4_ = auVar90._12_4_ ^ 0x80000000;
              auVar88 = vinsertps_avx(ZEXT416((uint)fVar218),auVar235,0x10);
              auVar212._0_4_ = auVar95._0_4_;
              auVar212._4_4_ = auVar212._0_4_;
              auVar212._8_4_ = auVar212._0_4_;
              auVar212._12_4_ = auVar212._0_4_;
              auVar90 = vdivps_avx(auVar91,auVar212);
              auVar91 = vdivps_avx(auVar88,auVar212);
              auVar213._0_4_ = fVar219 * auVar90._0_4_ + fVar221 * auVar91._0_4_;
              auVar213._4_4_ = fVar219 * auVar90._4_4_ + fVar221 * auVar91._4_4_;
              auVar213._8_4_ = fVar219 * auVar90._8_4_ + fVar221 * auVar91._8_4_;
              auVar213._12_4_ = fVar219 * auVar90._12_4_ + fVar221 * auVar91._12_4_;
              auVar90 = vsubps_avx(local_6a0._0_16_,auVar213);
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar91 = vandps_avx512vl(auVar89,auVar25);
              if (auVar91._0_4_ < auVar13._0_4_) {
                auVar91 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ + auVar92._0_4_)),local_660,
                                          ZEXT416(0x36000000));
                auVar26._8_4_ = 0x7fffffff;
                auVar26._0_8_ = 0x7fffffff7fffffff;
                auVar26._12_4_ = 0x7fffffff;
                auVar88 = vandps_avx512vl(ZEXT416((uint)fVar221),auVar26);
                if (auVar88._0_4_ < auVar91._0_4_) {
                  fVar217 = auVar90._0_4_ + (float)local_670._0_4_;
                  if ((fVar217 < fVar149) ||
                     (fVar218 = *(float *)(ray + k * 4 + 0x80), fVar218 < fVar217)) break;
                  auVar91 = vmovshdup_avx(auVar90);
                  fVar219 = auVar91._0_4_;
                  if ((fVar219 < 0.0) || (1.0 < fVar219)) break;
                  auVar68._12_4_ = 0;
                  auVar68._0_12_ = ZEXT412(0);
                  auVar140._4_12_ = ZEXT412(0);
                  auVar140._0_4_ = local_8c0._0_4_;
                  auVar91 = vrsqrt14ss_avx512f(auVar68 << 0x20,auVar140._0_16_);
                  fVar220 = auVar91._0_4_;
                  auVar91 = vmulss_avx512f(local_8c0._0_16_,ZEXT416(0xbf000000));
                  pGVar3 = (context->scene->geometries).items[uVar81].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                  fVar220 = fVar220 * 1.5 + auVar91._0_4_ * fVar220 * fVar220 * fVar220;
                  auVar214._0_4_ = local_8a0._0_4_ * fVar220;
                  auVar214._4_4_ = local_8a0._4_4_ * fVar220;
                  auVar214._8_4_ = local_8a0._8_4_ * fVar220;
                  auVar214._12_4_ = local_8a0._12_4_ * fVar220;
                  auVar89 = vfmadd213ps_fma(auVar94,auVar214,auVar93);
                  auVar91 = vshufps_avx(auVar214,auVar214,0xc9);
                  auVar88 = vshufps_avx(auVar93,auVar93,0xc9);
                  auVar215._0_4_ = auVar214._0_4_ * auVar88._0_4_;
                  auVar215._4_4_ = auVar214._4_4_ * auVar88._4_4_;
                  auVar215._8_4_ = auVar214._8_4_ * auVar88._8_4_;
                  auVar215._12_4_ = auVar214._12_4_ * auVar88._12_4_;
                  auVar92 = vfmsub231ps_fma(auVar215,auVar93,auVar91);
                  auVar91 = vshufps_avx(auVar92,auVar92,0xc9);
                  auVar88 = vshufps_avx(auVar89,auVar89,0xc9);
                  auVar92 = vshufps_avx(auVar92,auVar92,0xd2);
                  auVar157._0_4_ = auVar89._0_4_ * auVar92._0_4_;
                  auVar157._4_4_ = auVar89._4_4_ * auVar92._4_4_;
                  auVar157._8_4_ = auVar89._8_4_ * auVar92._8_4_;
                  auVar157._12_4_ = auVar89._12_4_ * auVar92._12_4_;
                  auVar91 = vfmsub231ps_fma(auVar157,auVar91,auVar88);
                  uVar166 = auVar91._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar217;
                    uVar2 = vextractps_avx(auVar91,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                    uVar2 = vextractps_avx(auVar91,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar166;
                    *(float *)(ray + k * 4 + 0xf0) = fVar219;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_998;
                    *(uint *)(ray + k * 4 + 0x120) = uVar81;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_510 = vshufps_avx(auVar90,auVar90,0x55);
                  local_540 = (RTCHitN  [16])vshufps_avx(auVar91,auVar91,0x55);
                  auStack_530 = vshufps_avx(auVar91,auVar91,0xaa);
                  local_520 = uVar166;
                  uStack_51c = uVar166;
                  uStack_518 = uVar166;
                  uStack_514 = uVar166;
                  local_500 = ZEXT416(0) << 0x20;
                  local_4f0 = local_560._0_8_;
                  uStack_4e8 = local_560._8_8_;
                  local_4e0 = local_550;
                  vpcmpeqd_avx2(ZEXT1632(local_550),ZEXT1632(local_550));
                  uStack_4cc = context->user->instID[0];
                  local_4d0 = uStack_4cc;
                  uStack_4c8 = uStack_4cc;
                  uStack_4c4 = uStack_4cc;
                  uStack_4c0 = context->user->instPrimID[0];
                  uStack_4bc = uStack_4c0;
                  uStack_4b8 = uStack_4c0;
                  uStack_4b4 = uStack_4c0;
                  *(float *)(ray + k * 4 + 0x80) = fVar217;
                  local_9b0 = local_570;
                  local_870.valid = (int *)local_9b0;
                  local_870.geometryUserPtr = pGVar3->userPtr;
                  local_870.context = context->user;
                  local_870.hit = local_540;
                  local_870.N = 4;
                  local_870.ray = (RTCRayN *)ray;
                  if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar247 = ZEXT1664(auVar245);
                    auVar252 = ZEXT1664(auVar250);
                    auVar256 = ZEXT1664(local_8a0._0_16_);
                    auVar258 = ZEXT1664(auVar155);
                    (*pGVar3->intersectionFilterN)(&local_870);
                    auVar274 = ZEXT3264(local_840);
                    auVar273 = ZEXT3264(local_980);
                    auVar272 = ZEXT3264(local_960);
                    auVar271 = ZEXT3264(local_820);
                    auVar270 = ZEXT3264(local_940);
                    auVar269 = ZEXT3264(local_800);
                    auVar268 = ZEXT3264(local_920);
                    auVar267 = ZEXT3264(local_7e0);
                    auVar266 = ZEXT3264(local_900);
                    auVar265 = ZEXT3264(local_8e0);
                  }
                  uVar85 = vptestmd_avx512vl(local_9b0,local_9b0);
                  if ((uVar85 & 0xf) != 0) {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar247 = ZEXT1664(auVar247._0_16_);
                      auVar252 = ZEXT1664(auVar252._0_16_);
                      auVar256 = ZEXT1664(auVar256._0_16_);
                      auVar258 = ZEXT1664(auVar258._0_16_);
                      (*p_Var4)(&local_870);
                      auVar274 = ZEXT3264(local_840);
                      auVar273 = ZEXT3264(local_980);
                      auVar272 = ZEXT3264(local_960);
                      auVar271 = ZEXT3264(local_820);
                      auVar270 = ZEXT3264(local_940);
                      auVar269 = ZEXT3264(local_800);
                      auVar268 = ZEXT3264(local_920);
                      auVar267 = ZEXT3264(local_7e0);
                      auVar266 = ZEXT3264(local_900);
                      auVar265 = ZEXT3264(local_8e0);
                    }
                    uVar85 = vptestmd_avx512vl(local_9b0,local_9b0);
                    uVar85 = uVar85 & 0xf;
                    bVar84 = (byte)uVar85;
                    if (bVar84 != 0) {
                      iVar69 = *(int *)(local_870.hit + 4);
                      iVar70 = *(int *)(local_870.hit + 8);
                      iVar71 = *(int *)(local_870.hit + 0xc);
                      bVar5 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar7 = SUB81(uVar85 >> 3,0);
                      *(uint *)(local_870.ray + 0xc0) =
                           (uint)(bVar84 & 1) * *(int *)local_870.hit |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_870.ray + 0xc0);
                      *(uint *)(local_870.ray + 0xc4) =
                           (uint)bVar5 * iVar69 | (uint)!bVar5 * *(int *)(local_870.ray + 0xc4);
                      *(uint *)(local_870.ray + 200) =
                           (uint)bVar6 * iVar70 | (uint)!bVar6 * *(int *)(local_870.ray + 200);
                      *(uint *)(local_870.ray + 0xcc) =
                           (uint)bVar7 * iVar71 | (uint)!bVar7 * *(int *)(local_870.ray + 0xcc);
                      iVar69 = *(int *)(local_870.hit + 0x14);
                      iVar70 = *(int *)(local_870.hit + 0x18);
                      iVar71 = *(int *)(local_870.hit + 0x1c);
                      bVar5 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar7 = SUB81(uVar85 >> 3,0);
                      *(uint *)(local_870.ray + 0xd0) =
                           (uint)(bVar84 & 1) * *(int *)(local_870.hit + 0x10) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_870.ray + 0xd0);
                      *(uint *)(local_870.ray + 0xd4) =
                           (uint)bVar5 * iVar69 | (uint)!bVar5 * *(int *)(local_870.ray + 0xd4);
                      *(uint *)(local_870.ray + 0xd8) =
                           (uint)bVar6 * iVar70 | (uint)!bVar6 * *(int *)(local_870.ray + 0xd8);
                      *(uint *)(local_870.ray + 0xdc) =
                           (uint)bVar7 * iVar71 | (uint)!bVar7 * *(int *)(local_870.ray + 0xdc);
                      iVar69 = *(int *)(local_870.hit + 0x24);
                      iVar70 = *(int *)(local_870.hit + 0x28);
                      iVar71 = *(int *)(local_870.hit + 0x2c);
                      bVar5 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar7 = SUB81(uVar85 >> 3,0);
                      *(uint *)(local_870.ray + 0xe0) =
                           (uint)(bVar84 & 1) * *(int *)(local_870.hit + 0x20) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_870.ray + 0xe0);
                      *(uint *)(local_870.ray + 0xe4) =
                           (uint)bVar5 * iVar69 | (uint)!bVar5 * *(int *)(local_870.ray + 0xe4);
                      *(uint *)(local_870.ray + 0xe8) =
                           (uint)bVar6 * iVar70 | (uint)!bVar6 * *(int *)(local_870.ray + 0xe8);
                      *(uint *)(local_870.ray + 0xec) =
                           (uint)bVar7 * iVar71 | (uint)!bVar7 * *(int *)(local_870.ray + 0xec);
                      iVar69 = *(int *)(local_870.hit + 0x34);
                      iVar70 = *(int *)(local_870.hit + 0x38);
                      iVar71 = *(int *)(local_870.hit + 0x3c);
                      bVar5 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar7 = SUB81(uVar85 >> 3,0);
                      *(uint *)(local_870.ray + 0xf0) =
                           (uint)(bVar84 & 1) * *(int *)(local_870.hit + 0x30) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_870.ray + 0xf0);
                      *(uint *)(local_870.ray + 0xf4) =
                           (uint)bVar5 * iVar69 | (uint)!bVar5 * *(int *)(local_870.ray + 0xf4);
                      *(uint *)(local_870.ray + 0xf8) =
                           (uint)bVar6 * iVar70 | (uint)!bVar6 * *(int *)(local_870.ray + 0xf8);
                      *(uint *)(local_870.ray + 0xfc) =
                           (uint)bVar7 * iVar71 | (uint)!bVar7 * *(int *)(local_870.ray + 0xfc);
                      iVar69 = *(int *)(local_870.hit + 0x44);
                      iVar70 = *(int *)(local_870.hit + 0x48);
                      iVar71 = *(int *)(local_870.hit + 0x4c);
                      bVar5 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar7 = SUB81(uVar85 >> 3,0);
                      *(uint *)(local_870.ray + 0x100) =
                           (uint)(bVar84 & 1) * *(int *)(local_870.hit + 0x40) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_870.ray + 0x100);
                      *(uint *)(local_870.ray + 0x104) =
                           (uint)bVar5 * iVar69 | (uint)!bVar5 * *(int *)(local_870.ray + 0x104);
                      *(uint *)(local_870.ray + 0x108) =
                           (uint)bVar6 * iVar70 | (uint)!bVar6 * *(int *)(local_870.ray + 0x108);
                      *(uint *)(local_870.ray + 0x10c) =
                           (uint)bVar7 * iVar71 | (uint)!bVar7 * *(int *)(local_870.ray + 0x10c);
                      auVar90 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x50));
                      *(undefined1 (*) [16])(local_870.ray + 0x110) = auVar90;
                      auVar90 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x60));
                      *(undefined1 (*) [16])(local_870.ray + 0x120) = auVar90;
                      auVar90 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x70));
                      *(undefined1 (*) [16])(local_870.ray + 0x130) = auVar90;
                      auVar90 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x80));
                      *(undefined1 (*) [16])(local_870.ray + 0x140) = auVar90;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar218;
                  break;
                }
              }
              lVar82 = lVar82 + -1;
            } while (lVar82 != 0);
            uVar166 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar164._4_4_ = uVar166;
            auVar164._0_4_ = uVar166;
            auVar164._8_4_ = uVar166;
            auVar164._12_4_ = uVar166;
            auVar164._16_4_ = uVar166;
            auVar164._20_4_ = uVar166;
            auVar164._24_4_ = uVar166;
            auVar164._28_4_ = uVar166;
            auVar73._4_4_ = fStack_41c;
            auVar73._0_4_ = local_420;
            auVar73._8_4_ = fStack_418;
            auVar73._12_4_ = fStack_414;
            auVar73._16_4_ = fStack_410;
            auVar73._20_4_ = fStack_40c;
            auVar73._24_4_ = fStack_408;
            auVar73._28_4_ = fStack_404;
            uVar14 = vcmpps_avx512vl(auVar164,auVar73,0xd);
            bVar83 = ~('\x01' << ((byte)iVar18 & 0x1f)) & bVar83 & (byte)uVar14;
          } while (bVar83 != 0);
          auVar138 = local_440;
          fVar201 = (float)local_740._0_4_;
          fVar217 = (float)local_740._4_4_;
          fVar218 = fStack_738;
          fVar219 = fStack_734;
          fVar220 = fStack_730;
          fVar221 = fStack_72c;
          fVar222 = fStack_728;
          fVar200 = fStack_724;
        }
        uVar16 = vpcmpgtd_avx512vl(auVar138,local_3e0);
        uVar17 = vpcmpd_avx512vl(local_3e0,local_360,1);
        auVar198._0_4_ = fVar201 + (float)local_200._0_4_;
        auVar198._4_4_ = fVar217 + (float)local_200._4_4_;
        auVar198._8_4_ = fVar218 + fStack_1f8;
        auVar198._12_4_ = fVar219 + fStack_1f4;
        auVar198._16_4_ = fVar220 + fStack_1f0;
        auVar198._20_4_ = fVar221 + fStack_1ec;
        auVar198._24_4_ = fVar222 + fStack_1e8;
        auVar198._28_4_ = fVar200 + fStack_1e4;
        uVar14 = vcmpps_avx512vl(auVar198,auVar164,2);
        bVar77 = bVar77 & (byte)uVar17 & (byte)uVar14;
        auVar199._0_4_ = fVar201 + local_3c0._0_4_;
        auVar199._4_4_ = fVar217 + local_3c0._4_4_;
        auVar199._8_4_ = fVar218 + local_3c0._8_4_;
        auVar199._12_4_ = fVar219 + local_3c0._12_4_;
        auVar199._16_4_ = fVar220 + local_3c0._16_4_;
        auVar199._20_4_ = fVar221 + local_3c0._20_4_;
        auVar199._24_4_ = fVar222 + local_3c0._24_4_;
        auVar199._28_4_ = fVar200 + local_3c0._28_4_;
        uVar14 = vcmpps_avx512vl(auVar199,auVar164,2);
        bVar75 = bVar75 & (byte)uVar16 & (byte)uVar14 | bVar77;
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar275 = ZEXT3264(auVar103);
        prim = local_630;
        if (bVar75 != 0) {
          abStack_180[uVar78 * 0x60] = bVar75;
          auVar141._0_4_ =
               (uint)(bVar77 & 1) * local_200._0_4_ |
               (uint)!(bool)(bVar77 & 1) * (int)local_3c0._0_4_;
          bVar5 = (bool)(bVar77 >> 1 & 1);
          auVar141._4_4_ = (uint)bVar5 * local_200._4_4_ | (uint)!bVar5 * (int)local_3c0._4_4_;
          bVar5 = (bool)(bVar77 >> 2 & 1);
          auVar141._8_4_ = (uint)bVar5 * (int)fStack_1f8 | (uint)!bVar5 * (int)local_3c0._8_4_;
          bVar5 = (bool)(bVar77 >> 3 & 1);
          auVar141._12_4_ = (uint)bVar5 * (int)fStack_1f4 | (uint)!bVar5 * (int)local_3c0._12_4_;
          bVar5 = (bool)(bVar77 >> 4 & 1);
          auVar141._16_4_ = (uint)bVar5 * (int)fStack_1f0 | (uint)!bVar5 * (int)local_3c0._16_4_;
          bVar5 = (bool)(bVar77 >> 5 & 1);
          auVar141._20_4_ = (uint)bVar5 * (int)fStack_1ec | (uint)!bVar5 * (int)local_3c0._20_4_;
          auVar141._24_4_ =
               (uint)(bVar77 >> 6) * (int)fStack_1e8 |
               (uint)!(bool)(bVar77 >> 6) * (int)local_3c0._24_4_;
          auVar141._28_4_ = local_3c0._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar78 * 0x60) = auVar141;
          uVar85 = vmovlps_avx(local_3f0);
          (&uStack_140)[uVar78 * 0xc] = uVar85;
          aiStack_138[uVar78 * 0x18] = iVar79 + 1;
          uVar78 = (ulong)((int)uVar78 + 1);
        }
      }
    }
    do {
      uVar87 = (uint)uVar78;
      uVar78 = (ulong)(uVar87 - 1);
      if (uVar87 == 0) {
        uVar166 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar38._4_4_ = uVar166;
        auVar38._0_4_ = uVar166;
        auVar38._8_4_ = uVar166;
        auVar38._12_4_ = uVar166;
        auVar38._16_4_ = uVar166;
        auVar38._20_4_ = uVar166;
        auVar38._24_4_ = uVar166;
        auVar38._28_4_ = uVar166;
        uVar14 = vcmpps_avx512vl(local_340,auVar38,2);
        uVar81 = (uint)local_628 & (uint)uVar14;
        local_628 = (ulong)uVar81;
        if (uVar81 == 0) {
          return;
        }
        goto LAB_01d0e680;
      }
      lVar82 = uVar78 * 0x60;
      auVar103 = *(undefined1 (*) [32])(auStack_160 + lVar82);
      auVar179._0_4_ = fVar201 + auVar103._0_4_;
      auVar179._4_4_ = fVar217 + auVar103._4_4_;
      auVar179._8_4_ = fVar218 + auVar103._8_4_;
      auVar179._12_4_ = fVar219 + auVar103._12_4_;
      auVar179._16_4_ = fVar220 + auVar103._16_4_;
      auVar179._20_4_ = fVar221 + auVar103._20_4_;
      auVar179._24_4_ = fVar222 + auVar103._24_4_;
      auVar179._28_4_ = fVar200 + auVar103._28_4_;
      uVar166 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar37._4_4_ = uVar166;
      auVar37._0_4_ = uVar166;
      auVar37._8_4_ = uVar166;
      auVar37._12_4_ = uVar166;
      auVar37._16_4_ = uVar166;
      auVar37._20_4_ = uVar166;
      auVar37._24_4_ = uVar166;
      auVar37._28_4_ = uVar166;
      uVar14 = vcmpps_avx512vl(auVar179,auVar37,2);
      uVar86 = (uint)uVar14 & (uint)abStack_180[lVar82];
    } while (uVar86 == 0);
    uVar85 = (&uStack_140)[uVar78 * 0xc];
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar85;
    auVar197._8_4_ = 0x7f800000;
    auVar197._0_8_ = 0x7f8000007f800000;
    auVar197._12_4_ = 0x7f800000;
    auVar197._16_4_ = 0x7f800000;
    auVar197._20_4_ = 0x7f800000;
    auVar197._24_4_ = 0x7f800000;
    auVar197._28_4_ = 0x7f800000;
    auVar101 = vblendmps_avx512vl(auVar197,auVar103);
    bVar75 = (byte)uVar86;
    auVar135._0_4_ =
         (uint)(bVar75 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar75 & 1) * (int)auVar103._0_4_;
    bVar5 = (bool)((byte)(uVar86 >> 1) & 1);
    auVar135._4_4_ = (uint)bVar5 * auVar101._4_4_ | (uint)!bVar5 * (int)auVar103._4_4_;
    bVar5 = (bool)((byte)(uVar86 >> 2) & 1);
    auVar135._8_4_ = (uint)bVar5 * auVar101._8_4_ | (uint)!bVar5 * (int)auVar103._8_4_;
    bVar5 = (bool)((byte)(uVar86 >> 3) & 1);
    auVar135._12_4_ = (uint)bVar5 * auVar101._12_4_ | (uint)!bVar5 * (int)auVar103._12_4_;
    bVar5 = (bool)((byte)(uVar86 >> 4) & 1);
    auVar135._16_4_ = (uint)bVar5 * auVar101._16_4_ | (uint)!bVar5 * (int)auVar103._16_4_;
    bVar5 = (bool)((byte)(uVar86 >> 5) & 1);
    auVar135._20_4_ = (uint)bVar5 * auVar101._20_4_ | (uint)!bVar5 * (int)auVar103._20_4_;
    bVar5 = (bool)((byte)(uVar86 >> 6) & 1);
    auVar135._24_4_ = (uint)bVar5 * auVar101._24_4_ | (uint)!bVar5 * (int)auVar103._24_4_;
    auVar135._28_4_ =
         (uVar86 >> 7) * auVar101._28_4_ | (uint)!SUB41(uVar86 >> 7,0) * (int)auVar103._28_4_;
    auVar103 = vshufps_avx(auVar135,auVar135,0xb1);
    auVar103 = vminps_avx(auVar135,auVar103);
    auVar101 = vshufpd_avx(auVar103,auVar103,5);
    auVar103 = vminps_avx(auVar103,auVar101);
    auVar101 = vpermpd_avx2(auVar103,0x4e);
    auVar103 = vminps_avx(auVar103,auVar101);
    uVar14 = vcmpps_avx512vl(auVar135,auVar103,0);
    bVar77 = (byte)uVar14 & bVar75;
    if (bVar77 != 0) {
      uVar86 = (uint)bVar77;
    }
    uVar142 = 0;
    for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
      uVar142 = uVar142 + 1;
    }
    iVar79 = aiStack_138[uVar78 * 0x18];
    bVar75 = ~('\x01' << ((byte)uVar142 & 0x1f)) & bVar75;
    abStack_180[lVar82] = bVar75;
    if (bVar75 == 0) {
      uVar87 = uVar87 - 1;
    }
    uVar166 = (undefined4)uVar85;
    auVar160._4_4_ = uVar166;
    auVar160._0_4_ = uVar166;
    auVar160._8_4_ = uVar166;
    auVar160._12_4_ = uVar166;
    auVar160._16_4_ = uVar166;
    auVar160._20_4_ = uVar166;
    auVar160._24_4_ = uVar166;
    auVar160._28_4_ = uVar166;
    auVar90 = vmovshdup_avx(auVar167);
    auVar90 = vsubps_avx(auVar90,auVar167);
    auVar180._0_4_ = auVar90._0_4_;
    auVar180._4_4_ = auVar180._0_4_;
    auVar180._8_4_ = auVar180._0_4_;
    auVar180._12_4_ = auVar180._0_4_;
    auVar180._16_4_ = auVar180._0_4_;
    auVar180._20_4_ = auVar180._0_4_;
    auVar180._24_4_ = auVar180._0_4_;
    auVar180._28_4_ = auVar180._0_4_;
    auVar90 = vfmadd132ps_fma(auVar180,auVar160,_DAT_01faff20);
    _local_540 = ZEXT1632(auVar90);
    local_3f0._8_8_ = 0;
    local_3f0._0_8_ = *(ulong *)(local_540 + (ulong)uVar142 * 4);
    uVar78 = (ulong)uVar87;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }